

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  undefined4 uVar31;
  bool bVar32;
  float fVar33;
  float fVar53;
  float fVar54;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar55;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  float fVar56;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar57;
  float fVar69;
  float fVar70;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar71;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar72;
  float fVar73;
  float fVar90;
  float fVar92;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar91;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  float fVar111;
  float fVar124;
  float fVar126;
  vfloat4 b0;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar125;
  float fVar127;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar128;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar129;
  float fVar130;
  float fVar138;
  float fVar141;
  undefined1 auVar131 [16];
  float fVar139;
  float fVar140;
  float fVar142;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar143;
  vfloat4 b0_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar152;
  undefined1 auVar151 [32];
  Vec3fa n0;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar166;
  float fVar175;
  float fVar176;
  vfloat4 a0;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar177;
  float fVar179;
  float fVar180;
  __m128 a;
  float fVar181;
  undefined1 auVar178 [32];
  float fVar182;
  float fVar183;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar192;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar193;
  float fVar194;
  undefined1 auVar195 [16];
  float fVar201;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar199;
  float fVar200;
  undefined1 auVar198 [64];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar206;
  float fVar211;
  float fVar212;
  Vec3fa n1;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  size_t local_288;
  size_t local_270;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 auVar52 [64];
  undefined1 auVar89 [64];
  
  auVar34._8_4_ = 0x7f800000;
  auVar34._0_8_ = 0x7f8000007f800000;
  auVar34._12_4_ = 0x7f800000;
  auVar52 = ZEXT1664(auVar34);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = auVar34;
  auVar74._8_4_ = 0xff800000;
  auVar74._0_8_ = 0xff800000ff800000;
  auVar74._12_4_ = 0xff800000;
  auVar89 = ZEXT1664(auVar74);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = auVar74;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
   m128 = auVar34;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = auVar74;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar29 = r->_begin;
  local_288 = __return_storage_ptr__->end;
  local_248 = auVar34;
  local_238 = auVar74;
  if (uVar29 < r->_end) {
    auVar110 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    auVar198 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    local_270 = k;
    do {
      uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar29);
      uVar25 = (ulong)uVar2;
      uVar30 = (ulong)(uVar2 + 3);
      pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar30 < (pBVar3->super_RawBufferView).num) {
        uVar23 = (ulong)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1);
        pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 normals.items;
        fVar143 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry
                  .maxRadiusScale;
        lVar27 = 0x10;
        bVar32 = false;
        uVar22 = 0;
        do {
          lVar28 = *(long *)((long)pBVar3 + lVar27 + -0x10);
          lVar5 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar27);
          lVar24 = lVar5 * (ulong)(uVar2 + 1);
          lVar26 = lVar5 * (ulong)(uVar2 + 2);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 0xc + lVar5 * uVar25)),
                                  ZEXT416(*(uint *)(lVar28 + 0xc + lVar24)),0x10);
          auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar28 + 0xc + lVar26)),0x20);
          auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar28 + 0xc + lVar5 * uVar30)),0x30);
          auVar58._8_4_ = 0x7fffffff;
          auVar58._0_8_ = 0x7fffffff7fffffff;
          auVar58._12_4_ = 0x7fffffff;
          auVar34 = vandps_avx(auVar34,auVar58);
          auVar74 = auVar110._0_16_;
          auVar34 = vcmpps_avx(auVar34,auVar74,5);
          if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar34[0xf] < '\0') break;
          auVar34 = *(undefined1 (*) [16])(lVar28 + lVar5 * uVar25);
          auVar35 = auVar198._0_16_;
          auVar58 = vcmpps_avx(auVar34,auVar35,6);
          auVar77 = vcmpps_avx(auVar34,auVar74,1);
          auVar58 = vandps_avx(auVar58,auVar77);
          uVar31 = vmovmskps_avx(auVar58);
          if ((~(byte)uVar31 & 7) != 0) break;
          auVar58 = *(undefined1 (*) [16])(lVar28 + lVar24);
          auVar77 = vcmpps_avx(auVar58,auVar35,6);
          auVar9 = vcmpps_avx(auVar58,auVar74,1);
          auVar77 = vandps_avx(auVar77,auVar9);
          uVar31 = vmovmskps_avx(auVar77);
          if ((~(byte)uVar31 & 7) != 0) break;
          auVar77 = *(undefined1 (*) [16])(lVar28 + lVar26);
          auVar9 = vcmpps_avx(auVar77,auVar35,6);
          auVar36 = vcmpps_avx(auVar77,auVar74,1);
          auVar9 = vandps_avx(auVar9,auVar36);
          uVar31 = vmovmskps_avx(auVar9);
          if ((~(byte)uVar31 & 7) != 0) break;
          auVar9 = *(undefined1 (*) [16])(lVar28 + lVar5 * uVar30);
          auVar36 = vcmpps_avx(auVar9,auVar35,6);
          auVar39 = vcmpps_avx(auVar9,auVar74,1);
          auVar36 = vandps_avx(auVar36,auVar39);
          uVar31 = vmovmskps_avx(auVar36);
          if ((~(byte)uVar31 & 7) != 0) break;
          lVar28 = *(long *)((long)pBVar4 + lVar27 + -0x10);
          lVar5 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar27);
          auVar36 = *(undefined1 (*) [16])(lVar28 + lVar5 * uVar25);
          auVar39 = vcmpps_avx(auVar36,auVar35,6);
          auVar10 = vcmpps_avx(auVar36,auVar74,1);
          auVar39 = vandps_avx(auVar39,auVar10);
          uVar31 = vmovmskps_avx(auVar39);
          if ((~(byte)uVar31 & 7) != 0) break;
          auVar39 = *(undefined1 (*) [16])(lVar28 + lVar5 * (ulong)(uVar2 + 1));
          auVar35 = vcmpps_avx(auVar39,auVar35,6);
          auVar74 = vcmpps_avx(auVar39,auVar74,1);
          auVar74 = vandps_avx(auVar35,auVar74);
          uVar31 = vmovmskps_avx(auVar74);
          if ((~(byte)uVar31 & 7) != 0) break;
          auVar74 = vshufps_avx(auVar34,auVar34,0xff);
          auVar74 = vinsertps_avx(auVar34,ZEXT416((uint)(auVar74._0_4_ * fVar143)),0x30);
          auVar34 = vshufps_avx(auVar58,auVar58,0xff);
          auVar58 = vinsertps_avx(auVar58,ZEXT416((uint)(auVar34._0_4_ * fVar143)),0x30);
          auVar34 = vshufps_avx(auVar77,auVar77,0xff);
          auVar77 = vinsertps_avx(auVar77,ZEXT416((uint)(auVar34._0_4_ * fVar143)),0x30);
          auVar34 = vshufps_avx(auVar9,auVar9,0xff);
          auVar35 = vinsertps_avx(auVar9,ZEXT416((uint)(auVar34._0_4_ * fVar143)),0x30);
          pfVar1 = (float *)(lVar28 + lVar5 * (ulong)(uVar2 + 2));
          fVar57 = *pfVar1;
          fVar69 = pfVar1[1];
          fVar70 = pfVar1[2];
          fVar71 = pfVar1[3];
          auVar34 = *(undefined1 (*) [16])(lVar28 + lVar5 * uVar30);
          fVar125 = auVar35._0_4_;
          fVar127 = auVar35._4_4_;
          fVar33 = auVar35._8_4_;
          fVar53 = auVar35._12_4_;
          fVar124 = auVar77._0_4_;
          fVar126 = auVar77._4_4_;
          fVar128 = auVar77._8_4_;
          fVar130 = auVar77._12_4_;
          fVar182 = auVar58._0_4_;
          fVar188 = auVar58._4_4_;
          fVar190 = auVar58._8_4_;
          fVar192 = auVar58._12_4_;
          auVar131._0_4_ = fVar182 * 0.0 + fVar124 * 0.5 + fVar125 * 0.0;
          auVar131._4_4_ = fVar188 * 0.0 + fVar126 * 0.5 + fVar127 * 0.0;
          auVar131._8_4_ = fVar190 * 0.0 + fVar128 * 0.5 + fVar33 * 0.0;
          auVar131._12_4_ = fVar192 * 0.0 + fVar130 * 0.5 + fVar53 * 0.0;
          fVar54 = auVar74._0_4_;
          auVar184._0_4_ = fVar54 * 0.5;
          fVar55 = auVar74._4_4_;
          auVar184._4_4_ = fVar55 * 0.5;
          fVar56 = auVar74._8_4_;
          auVar184._8_4_ = fVar56 * 0.5;
          fVar73 = auVar74._12_4_;
          auVar184._12_4_ = fVar73 * 0.5;
          auVar38 = vsubps_avx(auVar131,auVar184);
          fVar90 = auVar34._0_4_;
          fVar92 = auVar34._4_4_;
          fVar94 = auVar34._8_4_;
          fVar111 = auVar34._12_4_;
          fVar91 = auVar39._0_4_;
          fVar93 = auVar39._4_4_;
          fVar95 = auVar39._8_4_;
          fVar166 = auVar39._12_4_;
          auVar185._0_4_ = fVar91 * 0.0 + fVar57 * 0.5 + fVar90 * 0.0;
          auVar185._4_4_ = fVar93 * 0.0 + fVar69 * 0.5 + fVar92 * 0.0;
          auVar185._8_4_ = fVar95 * 0.0 + fVar70 * 0.5 + fVar94 * 0.0;
          auVar185._12_4_ = fVar166 * 0.0 + fVar71 * 0.5 + fVar111 * 0.0;
          fVar152 = auVar36._0_4_;
          auVar96._0_4_ = fVar152 * 0.5;
          fVar139 = auVar36._4_4_;
          auVar96._4_4_ = fVar139 * 0.5;
          fVar140 = auVar36._8_4_;
          auVar96._8_4_ = fVar140 * 0.5;
          fVar72 = auVar36._12_4_;
          auVar96._12_4_ = fVar72 * 0.5;
          auVar77 = vsubps_avx(auVar185,auVar96);
          fVar129 = fVar54 * -0.0 + fVar182 + fVar125 * -0.0 + fVar124 * 0.0;
          fVar138 = fVar55 * -0.0 + fVar188 + fVar127 * -0.0 + fVar126 * 0.0;
          fVar141 = fVar56 * -0.0 + fVar190 + fVar33 * -0.0 + fVar128 * 0.0;
          fVar142 = fVar73 * -0.0 + fVar192 + fVar53 * -0.0 + fVar130 * 0.0;
          auVar144._0_4_ = fVar54 * -0.0 + fVar182 * 0.0 + fVar125 * -0.0 + fVar124;
          auVar144._4_4_ = fVar55 * -0.0 + fVar188 * 0.0 + fVar127 * -0.0 + fVar126;
          auVar144._8_4_ = fVar56 * -0.0 + fVar190 * 0.0 + fVar33 * -0.0 + fVar128;
          auVar144._12_4_ = fVar73 * -0.0 + fVar192 * 0.0 + fVar53 * -0.0 + fVar130;
          auVar59._0_4_ = fVar125 * 0.5 + fVar124 * 0.0;
          auVar59._4_4_ = fVar127 * 0.5 + fVar126 * 0.0;
          auVar59._8_4_ = fVar33 * 0.5 + fVar128 * 0.0;
          auVar59._12_4_ = fVar53 * 0.5 + fVar130 * 0.0;
          auVar97._0_4_ = fVar152 * -0.0 + fVar91 + fVar57 * 0.0 + fVar90 * -0.0;
          auVar97._4_4_ = fVar139 * -0.0 + fVar93 + fVar69 * 0.0 + fVar92 * -0.0;
          auVar97._8_4_ = fVar140 * -0.0 + fVar95 + fVar70 * 0.0 + fVar94 * -0.0;
          auVar97._12_4_ = fVar72 * -0.0 + fVar166 + fVar71 * 0.0 + fVar111 * -0.0;
          auVar75._0_4_ = fVar182 * 0.5;
          auVar75._4_4_ = fVar188 * 0.5;
          auVar75._8_4_ = fVar190 * 0.5;
          auVar75._12_4_ = fVar192 * 0.5;
          auVar34 = vsubps_avx(auVar59,auVar75);
          auVar76._0_4_ = fVar54 * 0.0 + auVar34._0_4_;
          auVar76._4_4_ = fVar55 * 0.0 + auVar34._4_4_;
          auVar76._8_4_ = fVar56 * 0.0 + auVar34._8_4_;
          auVar76._12_4_ = fVar73 * 0.0 + auVar34._12_4_;
          auVar35._0_4_ = fVar152 * -0.0 + fVar91 * 0.0 + fVar57 + fVar90 * -0.0;
          auVar35._4_4_ = fVar139 * -0.0 + fVar93 * 0.0 + fVar69 + fVar92 * -0.0;
          auVar35._8_4_ = fVar140 * -0.0 + fVar95 * 0.0 + fVar70 + fVar94 * -0.0;
          auVar35._12_4_ = fVar72 * -0.0 + fVar166 * 0.0 + fVar71 + fVar111 * -0.0;
          auVar60._0_4_ = fVar57 * 0.0 + fVar90 * 0.5;
          auVar60._4_4_ = fVar69 * 0.0 + fVar92 * 0.5;
          auVar60._8_4_ = fVar70 * 0.0 + fVar94 * 0.5;
          auVar60._12_4_ = fVar71 * 0.0 + fVar111 * 0.5;
          auVar112._0_4_ = fVar91 * 0.5;
          auVar112._4_4_ = fVar93 * 0.5;
          auVar112._8_4_ = fVar95 * 0.5;
          auVar112._12_4_ = fVar166 * 0.5;
          auVar34 = vsubps_avx(auVar60,auVar112);
          auVar61._0_4_ = fVar152 * 0.0 + auVar34._0_4_;
          auVar61._4_4_ = fVar139 * 0.0 + auVar34._4_4_;
          auVar61._8_4_ = fVar140 * 0.0 + auVar34._8_4_;
          auVar61._12_4_ = fVar72 * 0.0 + auVar34._12_4_;
          auVar34 = vshufps_avx(auVar38,auVar38,0xc9);
          auVar74 = vshufps_avx(auVar97,auVar97,0xc9);
          fVar130 = auVar38._0_4_;
          auVar153._0_4_ = fVar130 * auVar74._0_4_;
          fVar139 = auVar38._4_4_;
          auVar153._4_4_ = fVar139 * auVar74._4_4_;
          fVar72 = auVar38._8_4_;
          auVar153._8_4_ = fVar72 * auVar74._8_4_;
          fVar92 = auVar38._12_4_;
          auVar153._12_4_ = fVar92 * auVar74._12_4_;
          auVar98._0_4_ = auVar97._0_4_ * auVar34._0_4_;
          auVar98._4_4_ = auVar97._4_4_ * auVar34._4_4_;
          auVar98._8_4_ = auVar97._8_4_ * auVar34._8_4_;
          auVar98._12_4_ = auVar97._12_4_ * auVar34._12_4_;
          auVar74 = vsubps_avx(auVar98,auVar153);
          auVar58 = vshufps_avx(auVar74,auVar74,0xc9);
          auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
          auVar99._0_4_ = fVar130 * auVar74._0_4_;
          auVar99._4_4_ = fVar139 * auVar74._4_4_;
          auVar99._8_4_ = fVar72 * auVar74._8_4_;
          auVar99._12_4_ = fVar92 * auVar74._12_4_;
          auVar113._0_4_ = auVar77._0_4_ * auVar34._0_4_;
          auVar113._4_4_ = auVar77._4_4_ * auVar34._4_4_;
          auVar113._8_4_ = auVar77._8_4_ * auVar34._8_4_;
          auVar113._12_4_ = auVar77._12_4_ * auVar34._12_4_;
          auVar34 = vsubps_avx(auVar113,auVar99);
          auVar77 = vshufps_avx(auVar34,auVar34,0xc9);
          auVar34 = vshufps_avx(auVar76,auVar76,0xc9);
          auVar74 = vshufps_avx(auVar35,auVar35,0xc9);
          auVar167._0_4_ = auVar74._0_4_ * auVar76._0_4_;
          auVar167._4_4_ = auVar74._4_4_ * auVar76._4_4_;
          auVar167._8_4_ = auVar74._8_4_ * auVar76._8_4_;
          auVar167._12_4_ = auVar74._12_4_ * auVar76._12_4_;
          auVar36._0_4_ = auVar35._0_4_ * auVar34._0_4_;
          auVar36._4_4_ = auVar35._4_4_ * auVar34._4_4_;
          auVar36._8_4_ = auVar35._8_4_ * auVar34._8_4_;
          auVar36._12_4_ = auVar35._12_4_ * auVar34._12_4_;
          auVar74 = vsubps_avx(auVar36,auVar167);
          auVar35 = vshufps_avx(auVar74,auVar74,0xc9);
          auVar74 = vshufps_avx(auVar61,auVar61,0xc9);
          auVar168._0_4_ = auVar74._0_4_ * auVar76._0_4_;
          auVar168._4_4_ = auVar74._4_4_ * auVar76._4_4_;
          auVar168._8_4_ = auVar74._8_4_ * auVar76._8_4_;
          auVar168._12_4_ = auVar74._12_4_ * auVar76._12_4_;
          auVar62._0_4_ = auVar61._0_4_ * auVar34._0_4_;
          auVar62._4_4_ = auVar61._4_4_ * auVar34._4_4_;
          auVar62._8_4_ = auVar61._8_4_ * auVar34._8_4_;
          auVar62._12_4_ = auVar61._12_4_ * auVar34._12_4_;
          auVar34 = vsubps_avx(auVar62,auVar168);
          auVar9 = vshufps_avx(auVar34,auVar34,0xc9);
          auVar34 = vdpps_avx(auVar58,auVar58,0x7f);
          fVar182 = auVar34._0_4_;
          auVar39 = ZEXT416((uint)fVar182);
          auVar74 = vrsqrtss_avx(auVar39,auVar39);
          fVar57 = auVar74._0_4_;
          auVar74 = vdpps_avx(auVar58,auVar77,0x7f);
          auVar36 = ZEXT416((uint)(fVar57 * 1.5 - fVar182 * 0.5 * fVar57 * fVar57 * fVar57));
          auVar36 = vshufps_avx(auVar36,auVar36,0);
          fVar57 = auVar36._0_4_ * auVar58._0_4_;
          fVar69 = auVar36._4_4_ * auVar58._4_4_;
          fVar70 = auVar36._8_4_ * auVar58._8_4_;
          fVar71 = auVar36._12_4_ * auVar58._12_4_;
          auVar34 = vshufps_avx(auVar34,auVar34,0);
          auVar100._0_4_ = auVar34._0_4_ * auVar77._0_4_;
          auVar100._4_4_ = auVar34._4_4_ * auVar77._4_4_;
          auVar100._8_4_ = auVar34._8_4_ * auVar77._8_4_;
          auVar100._12_4_ = auVar34._12_4_ * auVar77._12_4_;
          auVar34 = vshufps_avx(auVar74,auVar74,0);
          auVar154._0_4_ = auVar34._0_4_ * auVar58._0_4_;
          auVar154._4_4_ = auVar34._4_4_ * auVar58._4_4_;
          auVar154._8_4_ = auVar34._8_4_ * auVar58._8_4_;
          auVar154._12_4_ = auVar34._12_4_ * auVar58._12_4_;
          auVar59 = vsubps_avx(auVar100,auVar154);
          auVar34 = vrcpss_avx(auVar39,auVar39);
          auVar34 = ZEXT416((uint)((2.0 - fVar182 * auVar34._0_4_) * auVar34._0_4_));
          auVar77 = vshufps_avx(auVar34,auVar34,0);
          auVar74 = vdpps_avx(auVar35,auVar35,0x7f);
          auVar34 = vblendps_avx(auVar74,_DAT_01feba10,0xe);
          auVar58 = vrsqrtss_avx(auVar34,auVar34);
          fVar182 = auVar58._0_4_;
          auVar58 = ZEXT416((uint)(fVar182 * 1.5 - auVar74._0_4_ * 0.5 * fVar182 * fVar182 * fVar182
                                  ));
          auVar39 = vshufps_avx(auVar58,auVar58,0);
          fVar182 = auVar39._0_4_ * auVar35._0_4_;
          fVar188 = auVar39._4_4_ * auVar35._4_4_;
          fVar190 = auVar39._8_4_ * auVar35._8_4_;
          fVar192 = auVar39._12_4_ * auVar35._12_4_;
          auVar58 = vdpps_avx(auVar35,auVar9,0x7f);
          auVar10 = vshufps_avx(auVar74,auVar74,0);
          auVar114._0_4_ = auVar10._0_4_ * auVar9._0_4_;
          auVar114._4_4_ = auVar10._4_4_ * auVar9._4_4_;
          auVar114._8_4_ = auVar10._8_4_ * auVar9._8_4_;
          auVar114._12_4_ = auVar10._12_4_ * auVar9._12_4_;
          auVar58 = vshufps_avx(auVar58,auVar58,0);
          auVar37._0_4_ = auVar58._0_4_ * auVar35._0_4_;
          auVar37._4_4_ = auVar58._4_4_ * auVar35._4_4_;
          auVar37._8_4_ = auVar58._8_4_ * auVar35._8_4_;
          auVar37._12_4_ = auVar58._12_4_ * auVar35._12_4_;
          auVar35 = vsubps_avx(auVar114,auVar37);
          auVar34 = vrcpss_avx(auVar34,auVar34);
          auVar34 = ZEXT416((uint)(auVar34._0_4_ * (2.0 - auVar74._0_4_ * auVar34._0_4_)));
          auVar34 = vshufps_avx(auVar34,auVar34,0);
          auVar9._4_4_ = fVar138;
          auVar9._0_4_ = fVar129;
          auVar9._8_4_ = fVar141;
          auVar9._12_4_ = fVar142;
          auVar74 = vshufps_avx(auVar9,auVar9,0xff);
          auVar155._0_4_ = auVar74._0_4_ * fVar57;
          auVar155._4_4_ = auVar74._4_4_ * fVar69;
          auVar155._8_4_ = auVar74._8_4_ * fVar70;
          auVar155._12_4_ = auVar74._12_4_ * fVar71;
          auVar10 = vsubps_avx(auVar9,auVar155);
          auVar58 = vshufps_avx(auVar38,auVar38,0xff);
          auVar63._0_4_ =
               auVar58._0_4_ * fVar57 +
               auVar74._0_4_ * auVar36._0_4_ * auVar59._0_4_ * auVar77._0_4_;
          auVar63._4_4_ =
               auVar58._4_4_ * fVar69 +
               auVar74._4_4_ * auVar36._4_4_ * auVar59._4_4_ * auVar77._4_4_;
          auVar63._8_4_ =
               auVar58._8_4_ * fVar70 +
               auVar74._8_4_ * auVar36._8_4_ * auVar59._8_4_ * auVar77._8_4_;
          auVar63._12_4_ =
               auVar58._12_4_ * fVar71 +
               auVar74._12_4_ * auVar36._12_4_ * auVar59._12_4_ * auVar77._12_4_;
          auVar77 = vsubps_avx(auVar38,auVar63);
          fVar129 = fVar129 + auVar155._0_4_;
          fVar138 = fVar138 + auVar155._4_4_;
          fVar141 = fVar141 + auVar155._8_4_;
          fVar142 = fVar142 + auVar155._12_4_;
          auVar74 = vshufps_avx(auVar144,auVar144,0xff);
          auVar156._0_4_ = fVar182 * auVar74._0_4_;
          auVar156._4_4_ = fVar188 * auVar74._4_4_;
          auVar156._8_4_ = fVar190 * auVar74._8_4_;
          auVar156._12_4_ = fVar192 * auVar74._12_4_;
          auVar9 = vsubps_avx(auVar144,auVar156);
          auVar58 = vshufps_avx(auVar76,auVar76,0xff);
          auVar38._0_4_ =
               auVar58._0_4_ * fVar182 +
               auVar74._0_4_ * auVar39._0_4_ * auVar35._0_4_ * auVar34._0_4_;
          auVar38._4_4_ =
               auVar58._4_4_ * fVar188 +
               auVar74._4_4_ * auVar39._4_4_ * auVar35._4_4_ * auVar34._4_4_;
          auVar38._8_4_ =
               auVar58._8_4_ * fVar190 +
               auVar74._8_4_ * auVar39._8_4_ * auVar35._8_4_ * auVar34._8_4_;
          auVar38._12_4_ =
               auVar58._12_4_ * fVar192 +
               auVar74._12_4_ * auVar39._12_4_ * auVar35._12_4_ * auVar34._12_4_;
          auVar34 = vsubps_avx(auVar76,auVar38);
          local_268._4_4_ = auVar144._4_4_ + auVar156._4_4_;
          local_268._0_4_ = auVar144._0_4_ + auVar156._0_4_;
          fStack_260 = auVar144._8_4_ + auVar156._8_4_;
          fStack_25c = auVar144._12_4_ + auVar156._12_4_;
          auVar39._0_4_ = auVar10._0_4_ + auVar77._0_4_ * 0.33333334;
          auVar39._4_4_ = auVar10._4_4_ + auVar77._4_4_ * 0.33333334;
          auVar39._8_4_ = auVar10._8_4_ + auVar77._8_4_ * 0.33333334;
          auVar39._12_4_ = auVar10._12_4_ + auVar77._12_4_ * 0.33333334;
          auVar77._0_4_ = auVar34._0_4_ * 0.33333334;
          auVar77._4_4_ = auVar34._4_4_ * 0.33333334;
          auVar77._8_4_ = auVar34._8_4_ * 0.33333334;
          auVar77._12_4_ = auVar34._12_4_ * 0.33333334;
          auVar58 = vsubps_avx(auVar9,auVar77);
          auVar34 = vshufps_avx(auVar58,auVar58,0);
          auVar74 = vshufps_avx(auVar58,auVar58,0x55);
          auVar58 = vshufps_avx(auVar58,auVar58,0xaa);
          auVar77 = vshufps_avx(auVar9,auVar9,0);
          auVar35 = vshufps_avx(auVar9,auVar9,0x55);
          auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
          fVar53 = auVar77._0_4_;
          fVar54 = auVar77._4_4_;
          fVar55 = auVar77._8_4_;
          fVar56 = auVar77._12_4_;
          fVar181 = auVar35._0_4_;
          fVar183 = auVar35._4_4_;
          fVar189 = auVar35._8_4_;
          fVar191 = auVar9._0_4_;
          fVar193 = auVar9._4_4_;
          fVar194 = auVar9._8_4_;
          fVar111 = auVar34._0_4_;
          fVar125 = auVar34._4_4_;
          fVar127 = auVar34._8_4_;
          fVar33 = auVar34._12_4_;
          fVar192 = auVar74._0_4_;
          fVar124 = auVar74._4_4_;
          fVar126 = auVar74._8_4_;
          fVar95 = auVar58._0_4_;
          fVar166 = auVar58._4_4_;
          fVar175 = auVar58._8_4_;
          fVar176 = auVar58._12_4_;
          auVar34 = vshufps_avx(auVar39,auVar39,0);
          fVar177 = auVar34._0_4_;
          fVar179 = auVar34._4_4_;
          fVar180 = auVar34._8_4_;
          auVar58 = vshufps_avx(auVar39,auVar39,0x55);
          fVar152 = auVar58._0_4_;
          fVar140 = auVar58._4_4_;
          fVar90 = auVar58._8_4_;
          fVar94 = auVar58._12_4_;
          auVar58 = vshufps_avx(auVar39,auVar39,0xaa);
          fVar73 = auVar58._0_4_;
          fVar91 = auVar58._4_4_;
          fVar93 = auVar58._8_4_;
          auVar77 = vshufps_avx(auVar10,auVar10,0);
          fVar57 = auVar77._0_4_;
          fVar70 = auVar77._4_4_;
          fVar182 = auVar77._8_4_;
          fVar190 = auVar77._12_4_;
          auVar44._0_4_ =
               (float)bezier_basis0._476_4_ * fVar57 +
               fVar177 * (float)bezier_basis0._1632_4_ +
               fVar111 * (float)bezier_basis0._2788_4_ + fVar53 * (float)bezier_basis0._3944_4_;
          auVar44._4_4_ =
               (float)bezier_basis0._480_4_ * fVar70 +
               fVar179 * (float)bezier_basis0._1636_4_ +
               fVar125 * (float)bezier_basis0._2792_4_ + fVar54 * (float)bezier_basis0._3948_4_;
          auVar44._8_4_ =
               (float)bezier_basis0._484_4_ * fVar182 +
               fVar180 * (float)bezier_basis0._1640_4_ +
               fVar127 * (float)bezier_basis0._2796_4_ + fVar55 * (float)bezier_basis0._3952_4_;
          auVar44._12_4_ =
               (float)bezier_basis0._488_4_ * fVar190 +
               auVar34._12_4_ * (float)bezier_basis0._1644_4_ +
               fVar33 * (float)bezier_basis0._2800_4_ + fVar56 * (float)bezier_basis0._3956_4_;
          auVar44._16_4_ =
               (float)bezier_basis0._492_4_ * fVar57 +
               fVar177 * (float)bezier_basis0._1648_4_ +
               fVar111 * (float)bezier_basis0._2804_4_ + fVar53 * (float)bezier_basis0._3960_4_;
          auVar44._20_4_ =
               (float)bezier_basis0._496_4_ * fVar70 +
               fVar179 * (float)bezier_basis0._1652_4_ +
               fVar125 * (float)bezier_basis0._2808_4_ + fVar54 * (float)bezier_basis0._3964_4_;
          auVar44._24_4_ =
               (float)bezier_basis0._500_4_ * fVar182 +
               fVar180 * (float)bezier_basis0._1656_4_ +
               fVar127 * (float)bezier_basis0._2812_4_ + fVar55 * (float)bezier_basis0._3968_4_;
          auVar44._28_4_ = 0;
          auVar77 = vshufps_avx(auVar10,auVar10,0x55);
          fVar69 = auVar77._0_4_;
          fVar71 = auVar77._4_4_;
          fVar188 = auVar77._8_4_;
          auVar204._0_4_ =
               fVar152 * (float)bezier_basis0._1632_4_ +
               fVar192 * (float)bezier_basis0._2788_4_ + fVar181 * (float)bezier_basis0._3944_4_ +
               (float)bezier_basis0._476_4_ * fVar69;
          auVar204._4_4_ =
               fVar140 * (float)bezier_basis0._1636_4_ +
               fVar124 * (float)bezier_basis0._2792_4_ + fVar183 * (float)bezier_basis0._3948_4_ +
               (float)bezier_basis0._480_4_ * fVar71;
          auVar204._8_4_ =
               fVar90 * (float)bezier_basis0._1640_4_ +
               fVar126 * (float)bezier_basis0._2796_4_ + fVar189 * (float)bezier_basis0._3952_4_ +
               (float)bezier_basis0._484_4_ * fVar188;
          auVar204._12_4_ =
               fVar94 * (float)bezier_basis0._1644_4_ +
               auVar74._12_4_ * (float)bezier_basis0._2800_4_ +
               auVar35._12_4_ * (float)bezier_basis0._3956_4_ +
               (float)bezier_basis0._488_4_ * auVar77._12_4_;
          auVar204._16_4_ =
               fVar152 * (float)bezier_basis0._1648_4_ +
               fVar192 * (float)bezier_basis0._2804_4_ + fVar181 * (float)bezier_basis0._3960_4_ +
               (float)bezier_basis0._492_4_ * fVar69;
          auVar204._20_4_ =
               fVar140 * (float)bezier_basis0._1652_4_ +
               fVar124 * (float)bezier_basis0._2808_4_ + fVar183 * (float)bezier_basis0._3964_4_ +
               (float)bezier_basis0._496_4_ * fVar71;
          auVar204._24_4_ =
               fVar90 * (float)bezier_basis0._1656_4_ +
               fVar126 * (float)bezier_basis0._2812_4_ + fVar189 * (float)bezier_basis0._3968_4_ +
               (float)bezier_basis0._500_4_ * fVar188;
          auVar204._28_4_ = 0;
          auVar36 = vshufps_avx(auVar10,auVar10,0xaa);
          fVar199 = auVar36._0_4_;
          fVar200 = auVar36._4_4_;
          fVar201 = auVar36._8_4_;
          auVar65._0_4_ =
               fVar199 * (float)bezier_basis0._476_4_ +
               fVar95 * (float)bezier_basis0._2788_4_ + fVar191 * (float)bezier_basis0._3944_4_ +
               fVar73 * (float)bezier_basis0._1632_4_;
          auVar65._4_4_ =
               fVar200 * (float)bezier_basis0._480_4_ +
               fVar166 * (float)bezier_basis0._2792_4_ + fVar193 * (float)bezier_basis0._3948_4_ +
               fVar91 * (float)bezier_basis0._1636_4_;
          auVar65._8_4_ =
               fVar201 * (float)bezier_basis0._484_4_ +
               fVar175 * (float)bezier_basis0._2796_4_ + fVar194 * (float)bezier_basis0._3952_4_ +
               fVar93 * (float)bezier_basis0._1640_4_;
          auVar65._12_4_ =
               auVar36._12_4_ * (float)bezier_basis0._488_4_ +
               fVar176 * (float)bezier_basis0._2800_4_ +
               auVar9._12_4_ * (float)bezier_basis0._3956_4_ +
               auVar58._12_4_ * (float)bezier_basis0._1644_4_;
          auVar65._16_4_ =
               fVar199 * (float)bezier_basis0._492_4_ +
               fVar95 * (float)bezier_basis0._2804_4_ + fVar191 * (float)bezier_basis0._3960_4_ +
               fVar73 * (float)bezier_basis0._1648_4_;
          auVar65._20_4_ =
               fVar200 * (float)bezier_basis0._496_4_ +
               fVar166 * (float)bezier_basis0._2808_4_ + fVar193 * (float)bezier_basis0._3964_4_ +
               fVar91 * (float)bezier_basis0._1652_4_;
          auVar65._24_4_ =
               fVar201 * (float)bezier_basis0._500_4_ +
               fVar175 * (float)bezier_basis0._2812_4_ + fVar194 * (float)bezier_basis0._3968_4_ +
               fVar93 * (float)bezier_basis0._1656_4_;
          auVar65._28_4_ = 0;
          fVar128 = fVar176 + fVar33 + 0.0;
          auVar83._0_4_ =
               fVar57 * (float)bezier_basis0._5100_4_ +
               fVar177 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar111 + fVar53 * (float)bezier_basis0._8568_4_;
          auVar83._4_4_ =
               fVar70 * (float)bezier_basis0._5104_4_ +
               fVar179 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar125 + fVar54 * (float)bezier_basis0._8572_4_;
          auVar83._8_4_ =
               fVar182 * (float)bezier_basis0._5108_4_ +
               fVar180 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar127 + fVar55 * (float)bezier_basis0._8576_4_;
          auVar83._12_4_ =
               fVar190 * (float)bezier_basis0._5112_4_ +
               auVar34._12_4_ * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * fVar33 + fVar56 * (float)bezier_basis0._8580_4_;
          auVar83._16_4_ =
               fVar57 * (float)bezier_basis0._5116_4_ +
               fVar177 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar111 + fVar53 * (float)bezier_basis0._8584_4_;
          auVar83._20_4_ =
               fVar70 * (float)bezier_basis0._5120_4_ +
               fVar179 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar125 + fVar54 * (float)bezier_basis0._8588_4_;
          auVar83._24_4_ =
               fVar182 * (float)bezier_basis0._5124_4_ +
               fVar180 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar127 + fVar55 * (float)bezier_basis0._8592_4_;
          auVar83._28_4_ = fVar190 + fVar128;
          auVar45._0_4_ =
               fVar69 * (float)bezier_basis0._5100_4_ +
               fVar152 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar192 + fVar181 * (float)bezier_basis0._8568_4_;
          auVar45._4_4_ =
               fVar71 * (float)bezier_basis0._5104_4_ +
               fVar140 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar124 + fVar183 * (float)bezier_basis0._8572_4_;
          auVar45._8_4_ =
               fVar188 * (float)bezier_basis0._5108_4_ +
               fVar90 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar126 + fVar189 * (float)bezier_basis0._8576_4_;
          auVar45._12_4_ =
               auVar77._12_4_ * (float)bezier_basis0._5112_4_ +
               fVar94 * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * auVar74._12_4_ +
               auVar35._12_4_ * (float)bezier_basis0._8580_4_;
          auVar45._16_4_ =
               fVar69 * (float)bezier_basis0._5116_4_ +
               fVar152 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar192 + fVar181 * (float)bezier_basis0._8584_4_;
          auVar45._20_4_ =
               fVar71 * (float)bezier_basis0._5120_4_ +
               fVar140 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar124 + fVar183 * (float)bezier_basis0._8588_4_;
          auVar45._24_4_ =
               fVar188 * (float)bezier_basis0._5124_4_ +
               fVar90 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar126 + fVar189 * (float)bezier_basis0._8592_4_;
          auVar45._28_4_ = (float)bezier_basis0._6284_4_ + fVar94 + fVar56 + fVar33;
          auVar118._0_4_ =
               fVar199 * (float)bezier_basis0._5100_4_ +
               fVar73 * (float)bezier_basis0._6256_4_ +
               fVar95 * (float)bezier_basis0._7412_4_ + fVar191 * (float)bezier_basis0._8568_4_;
          auVar118._4_4_ =
               fVar200 * (float)bezier_basis0._5104_4_ +
               fVar91 * (float)bezier_basis0._6260_4_ +
               fVar166 * (float)bezier_basis0._7416_4_ + fVar193 * (float)bezier_basis0._8572_4_;
          auVar118._8_4_ =
               fVar201 * (float)bezier_basis0._5108_4_ +
               fVar93 * (float)bezier_basis0._6264_4_ +
               fVar175 * (float)bezier_basis0._7420_4_ + fVar194 * (float)bezier_basis0._8576_4_;
          auVar118._12_4_ =
               auVar36._12_4_ * (float)bezier_basis0._5112_4_ +
               auVar58._12_4_ * (float)bezier_basis0._6268_4_ +
               fVar176 * (float)bezier_basis0._7424_4_ +
               auVar9._12_4_ * (float)bezier_basis0._8580_4_;
          auVar118._16_4_ =
               fVar199 * (float)bezier_basis0._5116_4_ +
               fVar73 * (float)bezier_basis0._6272_4_ +
               fVar95 * (float)bezier_basis0._7428_4_ + fVar191 * (float)bezier_basis0._8584_4_;
          auVar118._20_4_ =
               fVar200 * (float)bezier_basis0._5120_4_ +
               fVar91 * (float)bezier_basis0._6276_4_ +
               fVar166 * (float)bezier_basis0._7432_4_ + fVar193 * (float)bezier_basis0._8588_4_;
          auVar118._24_4_ =
               fVar201 * (float)bezier_basis0._5124_4_ +
               fVar93 * (float)bezier_basis0._6280_4_ +
               fVar175 * (float)bezier_basis0._7436_4_ + fVar194 * (float)bezier_basis0._8592_4_;
          auVar118._28_4_ = fVar128 + fVar56 + fVar33 + fVar176 + fVar56;
          auVar172 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar8 = vblendps_avx(auVar83,auVar172,1);
          auVar172 = vblendps_avx(auVar45,auVar172,1);
          auVar173 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar84 = vblendps_avx(auVar118,auVar173,1);
          auVar174._4_4_ = auVar8._4_4_ * 0.055555556;
          auVar174._0_4_ = auVar8._0_4_ * 0.055555556;
          auVar174._8_4_ = auVar8._8_4_ * 0.055555556;
          auVar174._12_4_ = auVar8._12_4_ * 0.055555556;
          auVar174._16_4_ = auVar8._16_4_ * 0.055555556;
          auVar174._20_4_ = auVar8._20_4_ * 0.055555556;
          auVar174._24_4_ = auVar8._24_4_ * 0.055555556;
          auVar174._28_4_ = auVar8._28_4_;
          auVar8._4_4_ = auVar172._4_4_ * 0.055555556;
          auVar8._0_4_ = auVar172._0_4_ * 0.055555556;
          auVar8._8_4_ = auVar172._8_4_ * 0.055555556;
          auVar8._12_4_ = auVar172._12_4_ * 0.055555556;
          auVar8._16_4_ = auVar172._16_4_ * 0.055555556;
          auVar8._20_4_ = auVar172._20_4_ * 0.055555556;
          auVar8._24_4_ = auVar172._24_4_ * 0.055555556;
          auVar8._28_4_ = auVar172._28_4_;
          auVar172._4_4_ = auVar84._4_4_ * 0.055555556;
          auVar172._0_4_ = auVar84._0_4_ * 0.055555556;
          auVar172._8_4_ = auVar84._8_4_ * 0.055555556;
          auVar172._12_4_ = auVar84._12_4_ * 0.055555556;
          auVar172._16_4_ = auVar84._16_4_ * 0.055555556;
          auVar172._20_4_ = auVar84._20_4_ * 0.055555556;
          auVar172._24_4_ = auVar84._24_4_ * 0.055555556;
          auVar172._28_4_ = auVar84._28_4_;
          auVar174 = vsubps_avx(auVar44,auVar174);
          auVar120 = vsubps_avx(auVar204,auVar8);
          auVar14 = vsubps_avx(auVar65,auVar172);
          auVar8 = vblendps_avx(auVar83,auVar173,0x80);
          auVar172 = vblendps_avx(auVar45,auVar173,0x80);
          auVar84 = vblendps_avx(auVar118,auVar173,0x80);
          auVar164._0_4_ = auVar44._0_4_ + auVar8._0_4_ * 0.055555556;
          auVar164._4_4_ = auVar44._4_4_ + auVar8._4_4_ * 0.055555556;
          auVar164._8_4_ = auVar44._8_4_ + auVar8._8_4_ * 0.055555556;
          auVar164._12_4_ = auVar44._12_4_ + auVar8._12_4_ * 0.055555556;
          auVar164._16_4_ = auVar44._16_4_ + auVar8._16_4_ * 0.055555556;
          auVar164._20_4_ = auVar44._20_4_ + auVar8._20_4_ * 0.055555556;
          auVar164._24_4_ = auVar44._24_4_ + auVar8._24_4_ * 0.055555556;
          auVar164._28_4_ = auVar8._28_4_ + 0.0;
          auVar46._0_4_ = auVar204._0_4_ + auVar172._0_4_ * 0.055555556;
          auVar46._4_4_ = auVar204._4_4_ + auVar172._4_4_ * 0.055555556;
          auVar46._8_4_ = auVar204._8_4_ + auVar172._8_4_ * 0.055555556;
          auVar46._12_4_ = auVar204._12_4_ + auVar172._12_4_ * 0.055555556;
          auVar46._16_4_ = auVar204._16_4_ + auVar172._16_4_ * 0.055555556;
          auVar46._20_4_ = auVar204._20_4_ + auVar172._20_4_ * 0.055555556;
          auVar46._24_4_ = auVar204._24_4_ + auVar172._24_4_ * 0.055555556;
          auVar46._28_4_ = auVar172._28_4_ + 0.0;
          auVar119._0_4_ = auVar65._0_4_ + auVar84._0_4_ * 0.055555556;
          auVar119._4_4_ = auVar65._4_4_ + auVar84._4_4_ * 0.055555556;
          auVar119._8_4_ = auVar65._8_4_ + auVar84._8_4_ * 0.055555556;
          auVar119._12_4_ = auVar65._12_4_ + auVar84._12_4_ * 0.055555556;
          auVar119._16_4_ = auVar65._16_4_ + auVar84._16_4_ * 0.055555556;
          auVar119._20_4_ = auVar65._20_4_ + auVar84._20_4_ * 0.055555556;
          auVar119._24_4_ = auVar65._24_4_ + auVar84._24_4_ * 0.055555556;
          auVar119._28_4_ = auVar84._28_4_ + 0.0;
          auVar105._8_4_ = 0x7f800000;
          auVar105._0_8_ = 0x7f8000007f800000;
          auVar105._12_4_ = 0x7f800000;
          auVar105._16_4_ = 0x7f800000;
          auVar105._20_4_ = 0x7f800000;
          auVar105._24_4_ = 0x7f800000;
          auVar105._28_4_ = 0x7f800000;
          auVar8 = vminps_avx(auVar105,auVar44);
          auVar172 = vminps_avx(auVar105,auVar204);
          auVar84 = vminps_avx(auVar174,auVar164);
          auVar173 = vminps_avx(auVar8,auVar84);
          auVar8 = vminps_avx(auVar120,auVar46);
          auVar13 = vminps_avx(auVar172,auVar8);
          auVar8 = vminps_avx(auVar105,auVar65);
          auVar172 = vminps_avx(auVar14,auVar119);
          auVar196 = vminps_avx(auVar8,auVar172);
          auVar207._0_4_ = (fVar130 + auVar63._0_4_) * 0.33333334 + fVar129;
          auVar207._4_4_ = (fVar139 + auVar63._4_4_) * 0.33333334 + fVar138;
          auVar207._8_4_ = (fVar72 + auVar63._8_4_) * 0.33333334 + fVar141;
          auVar207._12_4_ = (fVar92 + auVar63._12_4_) * 0.33333334 + fVar142;
          auVar78._0_4_ = (auVar76._0_4_ + auVar38._0_4_) * 0.33333334;
          auVar78._4_4_ = (auVar76._4_4_ + auVar38._4_4_) * 0.33333334;
          auVar78._8_4_ = (auVar76._8_4_ + auVar38._8_4_) * 0.33333334;
          auVar78._12_4_ = (auVar76._12_4_ + auVar38._12_4_) * 0.33333334;
          auVar39 = vsubps_avx(_local_268,auVar78);
          auVar202._8_4_ = 0xff800000;
          auVar202._0_8_ = 0xff800000ff800000;
          auVar202._12_4_ = 0xff800000;
          auVar202._16_4_ = 0xff800000;
          auVar202._20_4_ = 0xff800000;
          auVar202._24_4_ = 0xff800000;
          auVar202._28_4_ = 0xff800000;
          auVar8 = vmaxps_avx(auVar202,auVar44);
          auVar172 = vmaxps_avx(auVar202,auVar204);
          auVar84 = vmaxps_avx(auVar202,auVar65);
          auVar174 = vmaxps_avx(auVar174,auVar164);
          auVar8 = vmaxps_avx(auVar8,auVar174);
          auVar174 = vmaxps_avx(auVar120,auVar46);
          auVar172 = vmaxps_avx(auVar172,auVar174);
          auVar174 = vmaxps_avx(auVar14,auVar119);
          auVar84 = vmaxps_avx(auVar84,auVar174);
          auVar174 = vshufps_avx(auVar173,auVar173,0xb1);
          auVar174 = vminps_avx(auVar173,auVar174);
          auVar120 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar120);
          auVar34 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar174 = vshufps_avx(auVar13,auVar13,0xb1);
          auVar174 = vminps_avx(auVar13,auVar174);
          auVar13 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar13);
          auVar74 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar74 = vunpcklps_avx(auVar34,auVar74);
          auVar174 = vshufps_avx(auVar196,auVar196,0xb1);
          auVar174 = vminps_avx(auVar196,auVar174);
          auVar13 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar13);
          auVar34 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar34 = vinsertps_avx(auVar74,auVar34,0x28);
          auVar174 = vshufps_avx(auVar8,auVar8,0xb1);
          auVar8 = vmaxps_avx(auVar8,auVar174);
          auVar174 = vshufpd_avx(auVar8,auVar8,5);
          auVar8 = vmaxps_avx(auVar8,auVar174);
          auVar74 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
          auVar8 = vshufps_avx(auVar172,auVar172,0xb1);
          auVar8 = vmaxps_avx(auVar172,auVar8);
          auVar172 = vshufpd_avx(auVar8,auVar8,5);
          auVar8 = vmaxps_avx(auVar8,auVar172);
          auVar58 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
          auVar58 = vunpcklps_avx(auVar74,auVar58);
          auVar8 = vshufps_avx(auVar84,auVar84,0xb1);
          auVar8 = vmaxps_avx(auVar84,auVar8);
          auVar172 = vshufpd_avx(auVar8,auVar8,5);
          auVar8 = vmaxps_avx(auVar8,auVar172);
          auVar74 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
          auVar74 = vinsertps_avx(auVar58,auVar74,0x28);
          auVar58 = vshufps_avx(auVar207,auVar207,0);
          auVar77 = vshufps_avx(auVar207,auVar207,0x55);
          auVar35 = vshufps_avx(auVar207,auVar207,0xaa);
          auVar9 = vshufps_avx(auVar39,auVar39,0);
          auVar36 = vshufps_avx(auVar39,auVar39,0x55);
          auVar39 = vshufps_avx(auVar39,auVar39,0xaa);
          auVar10 = vshufps_avx(_local_268,_local_268,0);
          auVar38 = vshufps_avx(_local_268,_local_268,0x55);
          auVar59 = vshufps_avx(_local_268,_local_268,0xaa);
          fVar188 = auVar10._0_4_;
          fVar190 = auVar10._4_4_;
          fVar192 = auVar10._8_4_;
          fVar124 = auVar10._12_4_;
          fVar139 = auVar38._0_4_;
          fVar140 = auVar38._4_4_;
          fVar72 = auVar38._8_4_;
          fVar90 = auVar38._12_4_;
          fVar54 = auVar59._0_4_;
          fVar55 = auVar59._4_4_;
          fVar56 = auVar59._8_4_;
          fVar126 = auVar9._0_4_;
          fVar128 = auVar9._4_4_;
          fVar130 = auVar9._8_4_;
          fVar152 = auVar9._12_4_;
          fVar57 = auVar173._28_4_;
          fVar179 = auVar36._0_4_;
          fVar180 = auVar36._4_4_;
          fVar181 = auVar36._8_4_;
          fVar73 = auVar39._0_4_;
          fVar91 = auVar39._4_4_;
          fVar93 = auVar39._8_4_;
          fVar92 = auVar58._0_4_;
          fVar94 = auVar58._4_4_;
          fVar111 = auVar58._8_4_;
          fVar125 = auVar58._12_4_;
          fVar127 = auVar77._0_4_;
          fVar33 = auVar77._4_4_;
          fVar53 = auVar77._8_4_;
          fVar95 = auVar35._0_4_;
          fVar166 = auVar35._4_4_;
          fVar175 = auVar35._8_4_;
          auVar10._4_4_ = fVar138;
          auVar10._0_4_ = fVar129;
          auVar10._8_4_ = fVar141;
          auVar10._12_4_ = fVar142;
          auVar58 = vshufps_avx(auVar10,auVar10,0);
          fVar142 = auVar58._0_4_;
          fVar176 = auVar58._4_4_;
          fVar177 = auVar58._8_4_;
          auVar203._0_4_ =
               fVar142 * (float)bezier_basis0._476_4_ +
               fVar92 * (float)bezier_basis0._1632_4_ +
               fVar126 * (float)bezier_basis0._2788_4_ + fVar188 * (float)bezier_basis0._3944_4_;
          auVar203._4_4_ =
               fVar176 * (float)bezier_basis0._480_4_ +
               fVar94 * (float)bezier_basis0._1636_4_ +
               fVar128 * (float)bezier_basis0._2792_4_ + fVar190 * (float)bezier_basis0._3948_4_;
          auVar203._8_4_ =
               fVar177 * (float)bezier_basis0._484_4_ +
               fVar111 * (float)bezier_basis0._1640_4_ +
               fVar130 * (float)bezier_basis0._2796_4_ + fVar192 * (float)bezier_basis0._3952_4_;
          auVar203._12_4_ =
               auVar58._12_4_ * (float)bezier_basis0._488_4_ +
               fVar125 * (float)bezier_basis0._1644_4_ +
               fVar152 * (float)bezier_basis0._2800_4_ + fVar124 * (float)bezier_basis0._3956_4_;
          auVar203._16_4_ =
               fVar142 * (float)bezier_basis0._492_4_ +
               fVar92 * (float)bezier_basis0._1648_4_ +
               fVar126 * (float)bezier_basis0._2804_4_ + fVar188 * (float)bezier_basis0._3960_4_;
          auVar203._20_4_ =
               fVar176 * (float)bezier_basis0._496_4_ +
               fVar94 * (float)bezier_basis0._1652_4_ +
               fVar128 * (float)bezier_basis0._2808_4_ + fVar190 * (float)bezier_basis0._3964_4_;
          auVar203._24_4_ =
               fVar177 * (float)bezier_basis0._500_4_ +
               fVar111 * (float)bezier_basis0._1656_4_ +
               fVar130 * (float)bezier_basis0._2812_4_ + fVar192 * (float)bezier_basis0._3968_4_;
          auVar203._28_4_ = fVar57 + fVar57 + 0.0 + 0.0;
          auVar9 = vshufps_avx(auVar10,auVar10,0x55);
          fVar129 = auVar9._0_4_;
          fVar138 = auVar9._4_4_;
          fVar141 = auVar9._8_4_;
          auVar149._0_4_ =
               fVar129 * (float)bezier_basis0._476_4_ +
               fVar127 * (float)bezier_basis0._1632_4_ +
               fVar179 * (float)bezier_basis0._2788_4_ + fVar139 * (float)bezier_basis0._3944_4_;
          auVar149._4_4_ =
               fVar138 * (float)bezier_basis0._480_4_ +
               fVar33 * (float)bezier_basis0._1636_4_ +
               fVar180 * (float)bezier_basis0._2792_4_ + fVar140 * (float)bezier_basis0._3948_4_;
          auVar149._8_4_ =
               fVar141 * (float)bezier_basis0._484_4_ +
               fVar53 * (float)bezier_basis0._1640_4_ +
               fVar181 * (float)bezier_basis0._2796_4_ + fVar72 * (float)bezier_basis0._3952_4_;
          auVar149._12_4_ =
               auVar9._12_4_ * (float)bezier_basis0._488_4_ +
               auVar77._12_4_ * (float)bezier_basis0._1644_4_ +
               auVar36._12_4_ * (float)bezier_basis0._2800_4_ +
               fVar90 * (float)bezier_basis0._3956_4_;
          auVar149._16_4_ =
               fVar129 * (float)bezier_basis0._492_4_ +
               fVar127 * (float)bezier_basis0._1648_4_ +
               fVar179 * (float)bezier_basis0._2804_4_ + fVar139 * (float)bezier_basis0._3960_4_;
          auVar149._20_4_ =
               fVar138 * (float)bezier_basis0._496_4_ +
               fVar33 * (float)bezier_basis0._1652_4_ +
               fVar180 * (float)bezier_basis0._2808_4_ + fVar140 * (float)bezier_basis0._3964_4_;
          auVar149._24_4_ =
               fVar141 * (float)bezier_basis0._500_4_ +
               fVar53 * (float)bezier_basis0._1656_4_ +
               fVar181 * (float)bezier_basis0._2812_4_ + fVar72 * (float)bezier_basis0._3968_4_;
          auVar149._28_4_ = fVar57 + fVar57 + 0.0 + 0.0;
          auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
          fVar69 = auVar10._0_4_;
          fVar70 = auVar10._4_4_;
          fVar71 = auVar10._8_4_;
          fVar182 = auVar10._12_4_;
          auVar178._0_4_ =
               fVar69 * (float)bezier_basis0._476_4_ +
               fVar95 * (float)bezier_basis0._1632_4_ +
               fVar73 * (float)bezier_basis0._2788_4_ + fVar54 * (float)bezier_basis0._3944_4_;
          auVar178._4_4_ =
               fVar70 * (float)bezier_basis0._480_4_ +
               fVar166 * (float)bezier_basis0._1636_4_ +
               fVar91 * (float)bezier_basis0._2792_4_ + fVar55 * (float)bezier_basis0._3948_4_;
          auVar178._8_4_ =
               fVar71 * (float)bezier_basis0._484_4_ +
               fVar175 * (float)bezier_basis0._1640_4_ +
               fVar93 * (float)bezier_basis0._2796_4_ + fVar56 * (float)bezier_basis0._3952_4_;
          auVar178._12_4_ =
               fVar182 * (float)bezier_basis0._488_4_ +
               auVar35._12_4_ * (float)bezier_basis0._1644_4_ +
               auVar39._12_4_ * (float)bezier_basis0._2800_4_ +
               auVar59._12_4_ * (float)bezier_basis0._3956_4_;
          auVar178._16_4_ =
               fVar69 * (float)bezier_basis0._492_4_ +
               fVar95 * (float)bezier_basis0._1648_4_ +
               fVar73 * (float)bezier_basis0._2804_4_ + fVar54 * (float)bezier_basis0._3960_4_;
          auVar178._20_4_ =
               fVar70 * (float)bezier_basis0._496_4_ +
               fVar166 * (float)bezier_basis0._1652_4_ +
               fVar91 * (float)bezier_basis0._2808_4_ + fVar55 * (float)bezier_basis0._3964_4_;
          auVar178._24_4_ =
               fVar71 * (float)bezier_basis0._500_4_ +
               fVar175 * (float)bezier_basis0._1656_4_ +
               fVar93 * (float)bezier_basis0._2812_4_ + fVar56 * (float)bezier_basis0._3968_4_;
          auVar178._28_4_ = fVar125 + fVar57 + fVar57 + 0.0;
          auVar66._0_4_ =
               fVar142 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._6256_4_ * fVar92 +
               fVar188 * (float)bezier_basis0._8568_4_ + fVar126 * (float)bezier_basis0._7412_4_;
          auVar66._4_4_ =
               fVar176 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._6260_4_ * fVar94 +
               fVar190 * (float)bezier_basis0._8572_4_ + fVar128 * (float)bezier_basis0._7416_4_;
          auVar66._8_4_ =
               fVar177 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._6264_4_ * fVar111 +
               fVar192 * (float)bezier_basis0._8576_4_ + fVar130 * (float)bezier_basis0._7420_4_;
          auVar66._12_4_ =
               auVar58._12_4_ * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._6268_4_ * fVar125 +
               fVar124 * (float)bezier_basis0._8580_4_ + fVar152 * (float)bezier_basis0._7424_4_;
          auVar66._16_4_ =
               fVar142 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._6272_4_ * fVar92 +
               fVar188 * (float)bezier_basis0._8584_4_ + fVar126 * (float)bezier_basis0._7428_4_;
          auVar66._20_4_ =
               fVar176 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._6276_4_ * fVar94 +
               fVar190 * (float)bezier_basis0._8588_4_ + fVar128 * (float)bezier_basis0._7432_4_;
          auVar66._24_4_ =
               fVar177 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._6280_4_ * fVar111 +
               fVar192 * (float)bezier_basis0._8592_4_ + fVar130 * (float)bezier_basis0._7436_4_;
          auVar66._28_4_ = fVar125 + fVar90 + fVar125 + fVar125 + (float)bezier_basis0._504_4_;
          auVar47._0_4_ =
               fVar129 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._6256_4_ * fVar127 +
               fVar179 * (float)bezier_basis0._7412_4_ + fVar139 * (float)bezier_basis0._8568_4_;
          auVar47._4_4_ =
               fVar138 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._6260_4_ * fVar33 +
               fVar180 * (float)bezier_basis0._7416_4_ + fVar140 * (float)bezier_basis0._8572_4_;
          auVar47._8_4_ =
               fVar141 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._6264_4_ * fVar53 +
               fVar181 * (float)bezier_basis0._7420_4_ + fVar72 * (float)bezier_basis0._8576_4_;
          auVar47._12_4_ =
               auVar9._12_4_ * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._6268_4_ * auVar77._12_4_ +
               auVar36._12_4_ * (float)bezier_basis0._7424_4_ +
               fVar90 * (float)bezier_basis0._8580_4_;
          auVar47._16_4_ =
               fVar129 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._6272_4_ * fVar127 +
               fVar179 * (float)bezier_basis0._7428_4_ + fVar139 * (float)bezier_basis0._8584_4_;
          auVar47._20_4_ =
               fVar138 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._6276_4_ * fVar33 +
               fVar180 * (float)bezier_basis0._7432_4_ + fVar140 * (float)bezier_basis0._8588_4_;
          auVar47._24_4_ =
               fVar141 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._6280_4_ * fVar53 +
               fVar181 * (float)bezier_basis0._7436_4_ + fVar72 * (float)bezier_basis0._8592_4_;
          auVar47._28_4_ = (float)bezier_basis0._6284_4_ + fVar152 + fVar124 + fVar90;
          auVar106._0_4_ =
               fVar69 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._6256_4_ * fVar95 +
               fVar73 * (float)bezier_basis0._7412_4_ + fVar54 * (float)bezier_basis0._8568_4_;
          auVar106._4_4_ =
               fVar70 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._6260_4_ * fVar166 +
               fVar91 * (float)bezier_basis0._7416_4_ + fVar55 * (float)bezier_basis0._8572_4_;
          auVar106._8_4_ =
               fVar71 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._6264_4_ * fVar175 +
               fVar93 * (float)bezier_basis0._7420_4_ + fVar56 * (float)bezier_basis0._8576_4_;
          auVar106._12_4_ =
               fVar182 * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._6268_4_ * auVar35._12_4_ +
               auVar39._12_4_ * (float)bezier_basis0._7424_4_ +
               auVar59._12_4_ * (float)bezier_basis0._8580_4_;
          auVar106._16_4_ =
               fVar69 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._6272_4_ * fVar95 +
               fVar73 * (float)bezier_basis0._7428_4_ + fVar54 * (float)bezier_basis0._8584_4_;
          auVar106._20_4_ =
               fVar70 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._6276_4_ * fVar166 +
               fVar91 * (float)bezier_basis0._7432_4_ + fVar55 * (float)bezier_basis0._8588_4_;
          auVar106._24_4_ =
               fVar71 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._6280_4_ * fVar175 +
               fVar93 * (float)bezier_basis0._7436_4_ + fVar56 * (float)bezier_basis0._8592_4_;
          auVar106._28_4_ = fVar182 + fVar152 + fVar125 + fVar90;
          auVar8 = vblendps_avx(auVar66,ZEXT832(0) << 0x20,1);
          auVar172 = vblendps_avx(auVar47,ZEXT832(0) << 0x20,1);
          auVar174 = ZEXT832(0) << 0x20;
          auVar84 = vblendps_avx(auVar106,auVar174,1);
          auVar173._4_4_ = auVar8._4_4_ * 0.055555556;
          auVar173._0_4_ = auVar8._0_4_ * 0.055555556;
          auVar173._8_4_ = auVar8._8_4_ * 0.055555556;
          auVar173._12_4_ = auVar8._12_4_ * 0.055555556;
          auVar173._16_4_ = auVar8._16_4_ * 0.055555556;
          auVar173._20_4_ = auVar8._20_4_ * 0.055555556;
          auVar173._24_4_ = auVar8._24_4_ * 0.055555556;
          auVar173._28_4_ = auVar8._28_4_;
          auVar13._4_4_ = auVar172._4_4_ * 0.055555556;
          auVar13._0_4_ = auVar172._0_4_ * 0.055555556;
          auVar13._8_4_ = auVar172._8_4_ * 0.055555556;
          auVar13._12_4_ = auVar172._12_4_ * 0.055555556;
          auVar13._16_4_ = auVar172._16_4_ * 0.055555556;
          auVar13._20_4_ = auVar172._20_4_ * 0.055555556;
          auVar13._24_4_ = auVar172._24_4_ * 0.055555556;
          auVar13._28_4_ = auVar172._28_4_;
          auVar196._4_4_ = auVar84._4_4_ * 0.055555556;
          auVar196._0_4_ = auVar84._0_4_ * 0.055555556;
          auVar196._8_4_ = auVar84._8_4_ * 0.055555556;
          auVar196._12_4_ = auVar84._12_4_ * 0.055555556;
          auVar196._16_4_ = auVar84._16_4_ * 0.055555556;
          auVar196._20_4_ = auVar84._20_4_ * 0.055555556;
          auVar196._24_4_ = auVar84._24_4_ * 0.055555556;
          auVar196._28_4_ = auVar84._28_4_;
          auVar120 = vsubps_avx(auVar203,auVar173);
          auVar14 = vsubps_avx(auVar149,auVar13);
          auVar44 = vsubps_avx(auVar178,auVar196);
          auVar8 = vblendps_avx(auVar66,auVar174,0x80);
          auVar172 = vblendps_avx(auVar47,auVar174,0x80);
          auVar84 = vblendps_avx(auVar106,auVar174,0x80);
          auVar67._0_4_ = auVar203._0_4_ + auVar8._0_4_ * 0.055555556;
          auVar67._4_4_ = auVar203._4_4_ + auVar8._4_4_ * 0.055555556;
          auVar67._8_4_ = auVar203._8_4_ + auVar8._8_4_ * 0.055555556;
          auVar67._12_4_ = auVar203._12_4_ + auVar8._12_4_ * 0.055555556;
          auVar67._16_4_ = auVar203._16_4_ + auVar8._16_4_ * 0.055555556;
          auVar67._20_4_ = auVar203._20_4_ + auVar8._20_4_ * 0.055555556;
          auVar67._24_4_ = auVar203._24_4_ + auVar8._24_4_ * 0.055555556;
          auVar67._28_4_ = auVar203._28_4_ + auVar8._28_4_;
          auVar48._0_4_ = auVar149._0_4_ + auVar172._0_4_ * 0.055555556;
          auVar48._4_4_ = auVar149._4_4_ + auVar172._4_4_ * 0.055555556;
          auVar48._8_4_ = auVar149._8_4_ + auVar172._8_4_ * 0.055555556;
          auVar48._12_4_ = auVar149._12_4_ + auVar172._12_4_ * 0.055555556;
          auVar48._16_4_ = auVar149._16_4_ + auVar172._16_4_ * 0.055555556;
          auVar48._20_4_ = auVar149._20_4_ + auVar172._20_4_ * 0.055555556;
          auVar48._24_4_ = auVar149._24_4_ + auVar172._24_4_ * 0.055555556;
          auVar48._28_4_ = auVar149._28_4_ + auVar172._28_4_;
          auVar107._0_4_ = auVar178._0_4_ + auVar84._0_4_ * 0.055555556;
          auVar107._4_4_ = auVar178._4_4_ + auVar84._4_4_ * 0.055555556;
          auVar107._8_4_ = auVar178._8_4_ + auVar84._8_4_ * 0.055555556;
          auVar107._12_4_ = auVar178._12_4_ + auVar84._12_4_ * 0.055555556;
          auVar107._16_4_ = auVar178._16_4_ + auVar84._16_4_ * 0.055555556;
          auVar107._20_4_ = auVar178._20_4_ + auVar84._20_4_ * 0.055555556;
          auVar107._24_4_ = auVar178._24_4_ + auVar84._24_4_ * 0.055555556;
          auVar107._28_4_ = auVar178._28_4_ + auVar84._28_4_;
          auVar84._8_4_ = 0x7f800000;
          auVar84._0_8_ = 0x7f8000007f800000;
          auVar84._12_4_ = 0x7f800000;
          auVar84._16_4_ = 0x7f800000;
          auVar84._20_4_ = 0x7f800000;
          auVar84._24_4_ = 0x7f800000;
          auVar84._28_4_ = 0x7f800000;
          auVar8 = vminps_avx(auVar84,auVar203);
          auVar172 = vminps_avx(auVar84,auVar149);
          auVar84 = vminps_avx(auVar84,auVar178);
          auVar174 = vminps_avx(auVar120,auVar67);
          auVar173 = vminps_avx(auVar8,auVar174);
          auVar8 = vminps_avx(auVar14,auVar48);
          auVar13 = vminps_avx(auVar172,auVar8);
          auVar8 = vminps_avx(auVar44,auVar107);
          auVar196 = vminps_avx(auVar84,auVar8);
          auVar8 = vmaxps_avx(auVar120,auVar67);
          auVar120._8_4_ = 0xff800000;
          auVar120._0_8_ = 0xff800000ff800000;
          auVar120._12_4_ = 0xff800000;
          auVar120._16_4_ = 0xff800000;
          auVar120._20_4_ = 0xff800000;
          auVar120._24_4_ = 0xff800000;
          auVar120._28_4_ = 0xff800000;
          auVar172 = vmaxps_avx(auVar120,auVar203);
          auVar8 = vmaxps_avx(auVar172,auVar8);
          auVar172 = vmaxps_avx(auVar14,auVar48);
          auVar84 = vmaxps_avx(auVar120,auVar149);
          auVar172 = vmaxps_avx(auVar84,auVar172);
          auVar84 = vmaxps_avx(auVar44,auVar107);
          auVar195._8_4_ = 0xddccb9a2;
          auVar195._0_8_ = 0xddccb9a2ddccb9a2;
          auVar195._12_4_ = 0xddccb9a2;
          auVar198 = ZEXT1664(auVar195);
          auVar174 = vmaxps_avx(auVar120,auVar178);
          auVar84 = vmaxps_avx(auVar174,auVar84);
          auVar174 = vshufps_avx(auVar173,auVar173,0xb1);
          auVar174 = vminps_avx(auVar173,auVar174);
          auVar173 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar173);
          auVar58 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar174 = vshufps_avx(auVar13,auVar13,0xb1);
          auVar174 = vminps_avx(auVar13,auVar174);
          auVar173 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar173);
          auVar77 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar77 = vunpcklps_avx(auVar58,auVar77);
          auVar174 = vshufps_avx(auVar196,auVar196,0xb1);
          auVar174 = vminps_avx(auVar196,auVar174);
          auVar173 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar173);
          auVar58 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar58 = vinsertps_avx(auVar77,auVar58,0x28);
          auVar77 = vminps_avx(auVar34,auVar58);
          auVar174 = vshufps_avx(auVar8,auVar8,0xb1);
          auVar8 = vmaxps_avx(auVar8,auVar174);
          auVar174 = vshufpd_avx(auVar8,auVar8,5);
          auVar8 = vmaxps_avx(auVar8,auVar174);
          auVar34 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
          auVar8 = vshufps_avx(auVar172,auVar172,0xb1);
          auVar8 = vmaxps_avx(auVar172,auVar8);
          auVar172 = vshufpd_avx(auVar8,auVar8,5);
          auVar8 = vmaxps_avx(auVar8,auVar172);
          auVar58 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
          auVar58 = vunpcklps_avx(auVar34,auVar58);
          auVar8 = vshufps_avx(auVar84,auVar84,0xb1);
          auVar8 = vmaxps_avx(auVar84,auVar8);
          auVar172 = vshufpd_avx(auVar8,auVar8,5);
          auVar8 = vmaxps_avx(auVar8,auVar172);
          auVar34 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
          auVar34 = vinsertps_avx(auVar58,auVar34,0x28);
          auVar74 = vmaxps_avx(auVar74,auVar34);
          auVar34 = vcmpps_avx(auVar77,auVar195,6);
          auVar101._8_4_ = 0x5dccb9a2;
          auVar101._0_8_ = 0x5dccb9a25dccb9a2;
          auVar101._12_4_ = 0x5dccb9a2;
          auVar110 = ZEXT1664(auVar101);
          auVar74 = vcmpps_avx(auVar74,auVar101,1);
          auVar34 = vandps_avx(auVar74,auVar34);
          uVar31 = vmovmskps_avx(auVar34);
          if ((~(byte)uVar31 & 7) != 0) break;
          bVar32 = uVar23 <= uVar22;
          uVar22 = uVar22 + 1;
          lVar27 = lVar27 + 0x38;
        } while (uVar23 + 1 != uVar22);
        if (bVar32) {
          pcVar6 = (pBVar3->super_RawBufferView).ptr_ofs;
          sVar7 = (pBVar3->super_RawBufferView).stride;
          lVar27 = sVar7 * (uVar2 + 1);
          lVar28 = sVar7 * (uVar2 + 2);
          fVar143 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                    super_CurveGeometry.maxRadiusScale;
          auVar34 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + sVar7 * uVar25),
                                  ZEXT416((uint)(fVar143 * *(float *)(pcVar6 + sVar7 * uVar25 + 0xc)
                                                )),0x30);
          auVar74 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar27),
                                  ZEXT416((uint)(fVar143 * *(float *)(pcVar6 + lVar27 + 0xc))),0x30)
          ;
          auVar58 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar28),
                                  ZEXT416((uint)(fVar143 * *(float *)(pcVar6 + lVar28 + 0xc))),0x30)
          ;
          auVar77 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + sVar7 * uVar30),
                                  ZEXT416((uint)(fVar143 * *(float *)(pcVar6 + sVar7 * uVar30 + 0xc)
                                                )),0x30);
          pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.normals.items;
          pcVar6 = (pBVar4->super_RawBufferView).ptr_ofs;
          sVar7 = (pBVar4->super_RawBufferView).stride;
          pfVar1 = (float *)(pcVar6 + uVar25 * sVar7);
          fVar71 = *pfVar1;
          fVar182 = pfVar1[1];
          fVar188 = pfVar1[2];
          fVar190 = pfVar1[3];
          pfVar1 = (float *)(pcVar6 + (uVar2 + 1) * sVar7);
          fVar192 = *pfVar1;
          fVar129 = pfVar1[1];
          fVar138 = pfVar1[2];
          fVar124 = pfVar1[3];
          pfVar1 = (float *)(pcVar6 + (uVar2 + 2) * sVar7);
          fVar141 = *pfVar1;
          fVar126 = pfVar1[1];
          fVar142 = pfVar1[2];
          fVar128 = pfVar1[3];
          pfVar1 = (float *)(pcVar6 + sVar7 * uVar30);
          fVar130 = *pfVar1;
          fVar152 = pfVar1[1];
          fVar139 = pfVar1[2];
          fVar140 = pfVar1[3];
          fVar53 = auVar77._0_4_;
          fVar54 = auVar77._4_4_;
          fVar55 = auVar77._8_4_;
          fVar56 = auVar77._12_4_;
          fVar143 = auVar58._0_4_;
          fVar57 = auVar58._4_4_;
          fVar69 = auVar58._8_4_;
          fVar70 = auVar58._12_4_;
          fVar111 = auVar74._0_4_;
          fVar125 = auVar74._4_4_;
          fVar127 = auVar74._8_4_;
          fVar33 = auVar74._12_4_;
          auVar40._0_4_ = fVar111 * 0.0 + fVar143 * 0.5 + fVar53 * 0.0;
          auVar40._4_4_ = fVar125 * 0.0 + fVar57 * 0.5 + fVar54 * 0.0;
          auVar40._8_4_ = fVar127 * 0.0 + fVar69 * 0.5 + fVar55 * 0.0;
          auVar40._12_4_ = fVar33 * 0.0 + fVar70 * 0.5 + fVar56 * 0.0;
          fVar72 = auVar34._0_4_;
          auVar186._0_4_ = fVar72 * 0.5;
          fVar90 = auVar34._4_4_;
          auVar186._4_4_ = fVar90 * 0.5;
          fVar92 = auVar34._8_4_;
          auVar186._8_4_ = fVar92 * 0.5;
          fVar94 = auVar34._12_4_;
          auVar186._12_4_ = fVar94 * 0.5;
          auVar38 = vsubps_avx(auVar40,auVar186);
          auVar187._0_4_ = fVar192 * 0.0 + fVar141 * 0.5 + fVar130 * 0.0;
          auVar187._4_4_ = fVar129 * 0.0 + fVar126 * 0.5 + fVar152 * 0.0;
          auVar187._8_4_ = fVar138 * 0.0 + fVar142 * 0.5 + fVar139 * 0.0;
          auVar187._12_4_ = fVar124 * 0.0 + fVar128 * 0.5 + fVar140 * 0.0;
          auVar208._0_4_ = fVar71 * 0.5;
          auVar208._4_4_ = fVar182 * 0.5;
          auVar208._8_4_ = fVar188 * 0.5;
          auVar208._12_4_ = fVar190 * 0.5;
          auVar77 = vsubps_avx(auVar187,auVar208);
          fVar73 = fVar72 * -0.0 + fVar111 + fVar143 * 0.0 + fVar53 * -0.0;
          fVar91 = fVar90 * -0.0 + fVar125 + fVar57 * 0.0 + fVar54 * -0.0;
          fVar93 = fVar92 * -0.0 + fVar127 + fVar69 * 0.0 + fVar55 * -0.0;
          fVar95 = fVar94 * -0.0 + fVar33 + fVar70 * 0.0 + fVar56 * -0.0;
          auVar102._0_4_ = fVar72 * -0.0 + fVar111 * 0.0 + fVar53 * -0.0 + fVar143;
          auVar102._4_4_ = fVar90 * -0.0 + fVar125 * 0.0 + fVar54 * -0.0 + fVar57;
          auVar102._8_4_ = fVar92 * -0.0 + fVar127 * 0.0 + fVar55 * -0.0 + fVar69;
          auVar102._12_4_ = fVar94 * -0.0 + fVar33 * 0.0 + fVar56 * -0.0 + fVar70;
          auVar157._0_4_ = fVar143 * 0.0 + fVar53 * 0.5;
          auVar157._4_4_ = fVar57 * 0.0 + fVar54 * 0.5;
          auVar157._8_4_ = fVar69 * 0.0 + fVar55 * 0.5;
          auVar157._12_4_ = fVar70 * 0.0 + fVar56 * 0.5;
          auVar209._0_4_ = fVar71 * -0.0 + fVar141 * 0.0 + fVar130 * -0.0 + fVar192;
          auVar209._4_4_ = fVar182 * -0.0 + fVar126 * 0.0 + fVar152 * -0.0 + fVar129;
          auVar209._8_4_ = fVar188 * -0.0 + fVar142 * 0.0 + fVar139 * -0.0 + fVar138;
          auVar209._12_4_ = fVar190 * -0.0 + fVar128 * 0.0 + fVar140 * -0.0 + fVar124;
          auVar115._0_4_ = fVar111 * 0.5;
          auVar115._4_4_ = fVar125 * 0.5;
          auVar115._8_4_ = fVar127 * 0.5;
          auVar115._12_4_ = fVar33 * 0.5;
          auVar34 = vsubps_avx(auVar157,auVar115);
          auVar116._0_4_ = fVar72 * 0.0 + auVar34._0_4_;
          auVar116._4_4_ = fVar90 * 0.0 + auVar34._4_4_;
          auVar116._8_4_ = fVar92 * 0.0 + auVar34._8_4_;
          auVar116._12_4_ = fVar94 * 0.0 + auVar34._12_4_;
          auVar79._0_4_ = fVar71 * -0.0 + fVar192 * 0.0 + fVar141 + fVar130 * -0.0;
          auVar79._4_4_ = fVar182 * -0.0 + fVar129 * 0.0 + fVar126 + fVar152 * -0.0;
          auVar79._8_4_ = fVar188 * -0.0 + fVar138 * 0.0 + fVar142 + fVar139 * -0.0;
          auVar79._12_4_ = fVar190 * -0.0 + fVar124 * 0.0 + fVar128 + fVar140 * -0.0;
          auVar158._0_4_ = fVar141 * 0.0 + fVar130 * 0.5;
          auVar158._4_4_ = fVar126 * 0.0 + fVar152 * 0.5;
          auVar158._8_4_ = fVar142 * 0.0 + fVar139 * 0.5;
          auVar158._12_4_ = fVar128 * 0.0 + fVar140 * 0.5;
          auVar145._0_4_ = fVar192 * 0.5;
          auVar145._4_4_ = fVar129 * 0.5;
          auVar145._8_4_ = fVar138 * 0.5;
          auVar145._12_4_ = fVar124 * 0.5;
          auVar34 = vsubps_avx(auVar158,auVar145);
          auVar132._0_4_ = fVar71 * 0.0 + auVar34._0_4_;
          auVar132._4_4_ = fVar182 * 0.0 + auVar34._4_4_;
          auVar132._8_4_ = fVar188 * 0.0 + auVar34._8_4_;
          auVar132._12_4_ = fVar190 * 0.0 + auVar34._12_4_;
          auVar34 = vshufps_avx(auVar38,auVar38,0xc9);
          auVar74 = vshufps_avx(auVar209,auVar209,0xc9);
          fVar33 = auVar38._0_4_;
          auVar159._0_4_ = fVar33 * auVar74._0_4_;
          fVar53 = auVar38._4_4_;
          auVar159._4_4_ = fVar53 * auVar74._4_4_;
          fVar54 = auVar38._8_4_;
          auVar159._8_4_ = fVar54 * auVar74._8_4_;
          fVar55 = auVar38._12_4_;
          auVar159._12_4_ = fVar55 * auVar74._12_4_;
          auVar161._0_4_ = auVar209._0_4_ * auVar34._0_4_;
          auVar161._4_4_ = auVar209._4_4_ * auVar34._4_4_;
          auVar161._8_4_ = auVar209._8_4_ * auVar34._8_4_;
          auVar161._12_4_ = auVar209._12_4_ * auVar34._12_4_;
          auVar74 = vsubps_avx(auVar161,auVar159);
          auVar58 = vshufps_avx(auVar74,auVar74,0xc9);
          auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
          auVar162._0_4_ = auVar74._0_4_ * fVar33;
          auVar162._4_4_ = auVar74._4_4_ * fVar53;
          auVar162._8_4_ = auVar74._8_4_ * fVar54;
          auVar162._12_4_ = auVar74._12_4_ * fVar55;
          auVar146._0_4_ = auVar77._0_4_ * auVar34._0_4_;
          auVar146._4_4_ = auVar77._4_4_ * auVar34._4_4_;
          auVar146._8_4_ = auVar77._8_4_ * auVar34._8_4_;
          auVar146._12_4_ = auVar77._12_4_ * auVar34._12_4_;
          auVar34 = vsubps_avx(auVar146,auVar162);
          auVar77 = vshufps_avx(auVar34,auVar34,0xc9);
          auVar34 = vshufps_avx(auVar116,auVar116,0xc9);
          auVar74 = vshufps_avx(auVar79,auVar79,0xc9);
          auVar169._0_4_ = auVar74._0_4_ * auVar116._0_4_;
          auVar169._4_4_ = auVar74._4_4_ * auVar116._4_4_;
          auVar169._8_4_ = auVar74._8_4_ * auVar116._8_4_;
          auVar169._12_4_ = auVar74._12_4_ * auVar116._12_4_;
          auVar80._0_4_ = auVar34._0_4_ * auVar79._0_4_;
          auVar80._4_4_ = auVar34._4_4_ * auVar79._4_4_;
          auVar80._8_4_ = auVar34._8_4_ * auVar79._8_4_;
          auVar80._12_4_ = auVar34._12_4_ * auVar79._12_4_;
          auVar74 = vsubps_avx(auVar80,auVar169);
          auVar35 = vshufps_avx(auVar74,auVar74,0xc9);
          auVar74 = vshufps_avx(auVar132,auVar132,0xc9);
          auVar170._0_4_ = auVar74._0_4_ * auVar116._0_4_;
          auVar170._4_4_ = auVar74._4_4_ * auVar116._4_4_;
          auVar170._8_4_ = auVar74._8_4_ * auVar116._8_4_;
          auVar170._12_4_ = auVar74._12_4_ * auVar116._12_4_;
          auVar133._0_4_ = auVar34._0_4_ * auVar132._0_4_;
          auVar133._4_4_ = auVar34._4_4_ * auVar132._4_4_;
          auVar133._8_4_ = auVar34._8_4_ * auVar132._8_4_;
          auVar133._12_4_ = auVar34._12_4_ * auVar132._12_4_;
          auVar74 = vsubps_avx(auVar133,auVar170);
          auVar34 = vdpps_avx(auVar58,auVar58,0x7f);
          auVar9 = vshufps_avx(auVar74,auVar74,0xc9);
          fVar71 = auVar34._0_4_;
          auVar39 = ZEXT416((uint)fVar71);
          auVar74 = vrsqrtss_avx(auVar39,auVar39);
          fVar143 = auVar74._0_4_;
          auVar74 = vdpps_avx(auVar58,auVar77,0x7f);
          auVar36 = ZEXT416((uint)(fVar143 * 1.5 - fVar71 * 0.5 * fVar143 * fVar143 * fVar143));
          auVar36 = vshufps_avx(auVar36,auVar36,0);
          fVar143 = auVar36._0_4_ * auVar58._0_4_;
          fVar57 = auVar36._4_4_ * auVar58._4_4_;
          fVar69 = auVar36._8_4_ * auVar58._8_4_;
          fVar70 = auVar36._12_4_ * auVar58._12_4_;
          auVar34 = vshufps_avx(auVar34,auVar34,0);
          auVar163._0_4_ = auVar34._0_4_ * auVar77._0_4_;
          auVar163._4_4_ = auVar34._4_4_ * auVar77._4_4_;
          auVar163._8_4_ = auVar34._8_4_ * auVar77._8_4_;
          auVar163._12_4_ = auVar34._12_4_ * auVar77._12_4_;
          auVar34 = vshufps_avx(auVar74,auVar74,0);
          auVar160._0_4_ = auVar34._0_4_ * auVar58._0_4_;
          auVar160._4_4_ = auVar34._4_4_ * auVar58._4_4_;
          auVar160._8_4_ = auVar34._8_4_ * auVar58._8_4_;
          auVar160._12_4_ = auVar34._12_4_ * auVar58._12_4_;
          auVar59 = vsubps_avx(auVar163,auVar160);
          auVar34 = vrcpss_avx(auVar39,auVar39);
          auVar74 = vdpps_avx(auVar35,auVar35,0x7f);
          auVar34 = ZEXT416((uint)(auVar34._0_4_ * (2.0 - fVar71 * auVar34._0_4_)));
          auVar77 = vshufps_avx(auVar34,auVar34,0);
          auVar34 = vblendps_avx(auVar74,_DAT_01feba10,0xe);
          auVar58 = vrsqrtss_avx(auVar34,auVar34);
          fVar71 = auVar58._0_4_;
          auVar58 = ZEXT416((uint)(fVar71 * 1.5 - auVar74._0_4_ * 0.5 * fVar71 * fVar71 * fVar71));
          auVar39 = vshufps_avx(auVar58,auVar58,0);
          auVar58 = vdpps_avx(auVar35,auVar9,0x7f);
          fVar71 = auVar39._0_4_ * auVar35._0_4_;
          fVar182 = auVar39._4_4_ * auVar35._4_4_;
          fVar188 = auVar39._8_4_ * auVar35._8_4_;
          fVar190 = auVar39._12_4_ * auVar35._12_4_;
          auVar10 = vshufps_avx(auVar74,auVar74,0);
          auVar134._0_4_ = auVar10._0_4_ * auVar9._0_4_;
          auVar134._4_4_ = auVar10._4_4_ * auVar9._4_4_;
          auVar134._8_4_ = auVar10._8_4_ * auVar9._8_4_;
          auVar134._12_4_ = auVar10._12_4_ * auVar9._12_4_;
          auVar58 = vshufps_avx(auVar58,auVar58,0);
          auVar81._0_4_ = auVar58._0_4_ * auVar35._0_4_;
          auVar81._4_4_ = auVar58._4_4_ * auVar35._4_4_;
          auVar81._8_4_ = auVar58._8_4_ * auVar35._8_4_;
          auVar81._12_4_ = auVar58._12_4_ * auVar35._12_4_;
          auVar35 = vsubps_avx(auVar134,auVar81);
          auVar34 = vrcpss_avx(auVar34,auVar34);
          auVar34 = ZEXT416((uint)((2.0 - auVar74._0_4_ * auVar34._0_4_) * auVar34._0_4_));
          auVar34 = vshufps_avx(auVar34,auVar34,0);
          auVar20._4_4_ = fVar91;
          auVar20._0_4_ = fVar73;
          auVar20._8_4_ = fVar93;
          auVar20._12_4_ = fVar95;
          auVar74 = vshufps_avx(auVar20,auVar20,0xff);
          auVar171._0_4_ = auVar74._0_4_ * fVar143;
          auVar171._4_4_ = auVar74._4_4_ * fVar57;
          auVar171._8_4_ = auVar74._8_4_ * fVar69;
          auVar171._12_4_ = auVar74._12_4_ * fVar70;
          auVar9 = vsubps_avx(auVar20,auVar171);
          auVar58 = vshufps_avx(auVar38,auVar38,0xff);
          auVar147._0_4_ =
               auVar58._0_4_ * fVar143 +
               auVar74._0_4_ * auVar36._0_4_ * auVar77._0_4_ * auVar59._0_4_;
          auVar147._4_4_ =
               auVar58._4_4_ * fVar57 +
               auVar74._4_4_ * auVar36._4_4_ * auVar77._4_4_ * auVar59._4_4_;
          auVar147._8_4_ =
               auVar58._8_4_ * fVar69 +
               auVar74._8_4_ * auVar36._8_4_ * auVar77._8_4_ * auVar59._8_4_;
          auVar147._12_4_ =
               auVar58._12_4_ * fVar70 +
               auVar74._12_4_ * auVar36._12_4_ * auVar77._12_4_ * auVar59._12_4_;
          auVar36 = vsubps_avx(auVar38,auVar147);
          fVar73 = auVar171._0_4_ + fVar73;
          fVar91 = auVar171._4_4_ + fVar91;
          fVar93 = auVar171._8_4_ + fVar93;
          fVar95 = auVar171._12_4_ + fVar95;
          auVar74 = vshufps_avx(auVar102,auVar102,0xff);
          auVar64._0_4_ = fVar71 * auVar74._0_4_;
          auVar64._4_4_ = fVar182 * auVar74._4_4_;
          auVar64._8_4_ = fVar188 * auVar74._8_4_;
          auVar64._12_4_ = fVar190 * auVar74._12_4_;
          auVar10 = vsubps_avx(auVar102,auVar64);
          auVar58 = vshufps_avx(auVar116,auVar116,0xff);
          auVar41._0_4_ =
               fVar71 * auVar58._0_4_ +
               auVar39._0_4_ * auVar35._0_4_ * auVar34._0_4_ * auVar74._0_4_;
          auVar41._4_4_ =
               fVar182 * auVar58._4_4_ +
               auVar39._4_4_ * auVar35._4_4_ * auVar34._4_4_ * auVar74._4_4_;
          auVar41._8_4_ =
               fVar188 * auVar58._8_4_ +
               auVar39._8_4_ * auVar35._8_4_ * auVar34._8_4_ * auVar74._8_4_;
          auVar41._12_4_ =
               fVar190 * auVar58._12_4_ +
               auVar39._12_4_ * auVar35._12_4_ * auVar34._12_4_ * auVar74._12_4_;
          auVar34 = vsubps_avx(auVar116,auVar41);
          local_188._4_4_ = auVar102._4_4_ + auVar64._4_4_;
          local_188._0_4_ = auVar102._0_4_ + auVar64._0_4_;
          fStack_180 = auVar102._8_4_ + auVar64._8_4_;
          fStack_17c = auVar102._12_4_ + auVar64._12_4_;
          auVar42._0_4_ = auVar34._0_4_ * 0.33333334;
          auVar42._4_4_ = auVar34._4_4_ * 0.33333334;
          auVar42._8_4_ = auVar34._8_4_ * 0.33333334;
          auVar42._12_4_ = auVar34._12_4_ * 0.33333334;
          auVar35 = vsubps_avx(auVar10,auVar42);
          auVar34 = vshufps_avx(auVar35,auVar35,0);
          auVar74 = vshufps_avx(auVar35,auVar35,0x55);
          auVar58 = vshufps_avx(auVar10,auVar10,0);
          auVar77 = vshufps_avx(auVar10,auVar10,0x55);
          fVar177 = auVar58._0_4_;
          fVar179 = auVar58._4_4_;
          fVar180 = auVar58._8_4_;
          fVar181 = auVar58._12_4_;
          fVar143 = auVar34._0_4_;
          fVar190 = auVar34._4_4_;
          fVar142 = auVar34._8_4_;
          fVar90 = auVar34._12_4_;
          fVar183 = auVar77._0_4_;
          fVar189 = auVar77._4_4_;
          fVar191 = auVar77._8_4_;
          fVar193 = auVar77._12_4_;
          fVar57 = auVar74._0_4_;
          fVar192 = auVar74._4_4_;
          fVar128 = auVar74._8_4_;
          fVar92 = auVar74._12_4_;
          auVar34 = vshufps_avx(auVar35,auVar35,0xaa);
          auVar74 = vshufps_avx(auVar10,auVar10,0xaa);
          fVar206 = auVar74._0_4_;
          fVar211 = auVar74._4_4_;
          fVar212 = auVar74._8_4_;
          fVar194 = auVar34._0_4_;
          fVar199 = auVar34._4_4_;
          fVar200 = auVar34._8_4_;
          fVar201 = auVar34._12_4_;
          auVar148._0_4_ = auVar9._0_4_ + auVar36._0_4_ * 0.33333334;
          auVar148._4_4_ = auVar9._4_4_ + auVar36._4_4_ * 0.33333334;
          auVar148._8_4_ = auVar9._8_4_ + auVar36._8_4_ * 0.33333334;
          auVar148._12_4_ = auVar9._12_4_ + auVar36._12_4_ * 0.33333334;
          auVar34 = vshufps_avx(auVar148,auVar148,0);
          fVar69 = auVar34._0_4_;
          fVar129 = auVar34._4_4_;
          fVar130 = auVar34._8_4_;
          fVar94 = auVar34._12_4_;
          auVar34 = vshufps_avx(auVar148,auVar148,0x55);
          fVar70 = auVar34._0_4_;
          fVar138 = auVar34._4_4_;
          fVar152 = auVar34._8_4_;
          fVar111 = auVar34._12_4_;
          auVar34 = vshufps_avx(auVar148,auVar148,0xaa);
          fVar71 = auVar34._0_4_;
          fVar124 = auVar34._4_4_;
          fVar139 = auVar34._8_4_;
          fVar125 = auVar34._12_4_;
          auVar34 = vshufps_avx(auVar9,auVar9,0);
          fVar182 = auVar34._0_4_;
          fVar141 = auVar34._4_4_;
          fVar140 = auVar34._8_4_;
          fVar127 = auVar34._12_4_;
          auVar205._0_4_ =
               (float)bezier_basis0._476_4_ * fVar182 +
               (float)bezier_basis0._1632_4_ * fVar69 +
               (float)bezier_basis0._2788_4_ * fVar143 + fVar177 * (float)bezier_basis0._3944_4_;
          auVar205._4_4_ =
               (float)bezier_basis0._480_4_ * fVar141 +
               (float)bezier_basis0._1636_4_ * fVar129 +
               (float)bezier_basis0._2792_4_ * fVar190 + fVar179 * (float)bezier_basis0._3948_4_;
          auVar205._8_4_ =
               (float)bezier_basis0._484_4_ * fVar140 +
               (float)bezier_basis0._1640_4_ * fVar130 +
               (float)bezier_basis0._2796_4_ * fVar142 + fVar180 * (float)bezier_basis0._3952_4_;
          auVar205._12_4_ =
               (float)bezier_basis0._488_4_ * fVar127 +
               (float)bezier_basis0._1644_4_ * fVar94 +
               (float)bezier_basis0._2800_4_ * fVar90 + fVar181 * (float)bezier_basis0._3956_4_;
          auVar205._16_4_ =
               (float)bezier_basis0._492_4_ * fVar182 +
               (float)bezier_basis0._1648_4_ * fVar69 +
               (float)bezier_basis0._2804_4_ * fVar143 + fVar177 * (float)bezier_basis0._3960_4_;
          auVar205._20_4_ =
               (float)bezier_basis0._496_4_ * fVar141 +
               (float)bezier_basis0._1652_4_ * fVar129 +
               (float)bezier_basis0._2808_4_ * fVar190 + fVar179 * (float)bezier_basis0._3964_4_;
          auVar205._24_4_ =
               (float)bezier_basis0._500_4_ * fVar140 +
               (float)bezier_basis0._1656_4_ * fVar130 +
               (float)bezier_basis0._2812_4_ * fVar142 + fVar180 * (float)bezier_basis0._3968_4_;
          auVar205._28_4_ = (float)bezier_basis0._3972_4_ + 0.0 + fVar90 + 0.0 + 0.0;
          auVar34 = vshufps_avx(auVar9,auVar9,0x55);
          fVar188 = auVar34._0_4_;
          fVar126 = auVar34._4_4_;
          fVar72 = auVar34._8_4_;
          auVar165._0_4_ =
               (float)bezier_basis0._476_4_ * fVar188 +
               (float)bezier_basis0._1632_4_ * fVar70 +
               (float)bezier_basis0._2788_4_ * fVar57 + fVar183 * (float)bezier_basis0._3944_4_;
          auVar165._4_4_ =
               (float)bezier_basis0._480_4_ * fVar126 +
               (float)bezier_basis0._1636_4_ * fVar138 +
               (float)bezier_basis0._2792_4_ * fVar192 + fVar189 * (float)bezier_basis0._3948_4_;
          auVar165._8_4_ =
               (float)bezier_basis0._484_4_ * fVar72 +
               (float)bezier_basis0._1640_4_ * fVar152 +
               (float)bezier_basis0._2796_4_ * fVar128 + fVar191 * (float)bezier_basis0._3952_4_;
          auVar165._12_4_ =
               (float)bezier_basis0._488_4_ * auVar34._12_4_ +
               (float)bezier_basis0._1644_4_ * fVar111 +
               (float)bezier_basis0._2800_4_ * fVar92 + fVar193 * (float)bezier_basis0._3956_4_;
          auVar165._16_4_ =
               (float)bezier_basis0._492_4_ * fVar188 +
               (float)bezier_basis0._1648_4_ * fVar70 +
               (float)bezier_basis0._2804_4_ * fVar57 + fVar183 * (float)bezier_basis0._3960_4_;
          auVar165._20_4_ =
               (float)bezier_basis0._496_4_ * fVar126 +
               (float)bezier_basis0._1652_4_ * fVar138 +
               (float)bezier_basis0._2808_4_ * fVar192 + fVar189 * (float)bezier_basis0._3964_4_;
          auVar165._24_4_ =
               (float)bezier_basis0._500_4_ * fVar72 +
               (float)bezier_basis0._1656_4_ * fVar152 +
               (float)bezier_basis0._2812_4_ * fVar128 + fVar191 * (float)bezier_basis0._3968_4_;
          auVar165._28_4_ = (float)bezier_basis0._504_4_ + fVar92 + fVar90 + 0.0;
          auVar58 = vshufps_avx(auVar9,auVar9,0xaa);
          fVar166 = auVar58._0_4_;
          fVar175 = auVar58._4_4_;
          fVar176 = auVar58._8_4_;
          auVar135._0_4_ =
               (float)bezier_basis0._1632_4_ * fVar71 +
               fVar194 * (float)bezier_basis0._2788_4_ + fVar206 * (float)bezier_basis0._3944_4_ +
               fVar166 * (float)bezier_basis0._476_4_;
          auVar135._4_4_ =
               (float)bezier_basis0._1636_4_ * fVar124 +
               fVar199 * (float)bezier_basis0._2792_4_ + fVar211 * (float)bezier_basis0._3948_4_ +
               fVar175 * (float)bezier_basis0._480_4_;
          auVar135._8_4_ =
               (float)bezier_basis0._1640_4_ * fVar139 +
               fVar200 * (float)bezier_basis0._2796_4_ + fVar212 * (float)bezier_basis0._3952_4_ +
               fVar176 * (float)bezier_basis0._484_4_;
          auVar135._12_4_ =
               (float)bezier_basis0._1644_4_ * fVar125 +
               fVar201 * (float)bezier_basis0._2800_4_ +
               auVar74._12_4_ * (float)bezier_basis0._3956_4_ +
               auVar58._12_4_ * (float)bezier_basis0._488_4_;
          auVar135._16_4_ =
               (float)bezier_basis0._1648_4_ * fVar71 +
               fVar194 * (float)bezier_basis0._2804_4_ + fVar206 * (float)bezier_basis0._3960_4_ +
               fVar166 * (float)bezier_basis0._492_4_;
          auVar135._20_4_ =
               (float)bezier_basis0._1652_4_ * fVar124 +
               fVar199 * (float)bezier_basis0._2808_4_ + fVar211 * (float)bezier_basis0._3964_4_ +
               fVar175 * (float)bezier_basis0._496_4_;
          auVar135._24_4_ =
               (float)bezier_basis0._1656_4_ * fVar139 +
               fVar200 * (float)bezier_basis0._2812_4_ + fVar212 * (float)bezier_basis0._3968_4_ +
               fVar176 * (float)bezier_basis0._500_4_;
          auVar135._28_4_ = (float)bezier_basis0._3972_4_ + 0.0 + 0.0 + 0.0;
          fVar56 = fVar94 + fVar181 + 0.0;
          auVar85._0_4_ =
               fVar182 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._6256_4_ * fVar69 +
               (float)bezier_basis0._7412_4_ * fVar143 + fVar177 * (float)bezier_basis0._8568_4_;
          auVar85._4_4_ =
               fVar141 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._6260_4_ * fVar129 +
               (float)bezier_basis0._7416_4_ * fVar190 + fVar179 * (float)bezier_basis0._8572_4_;
          auVar85._8_4_ =
               fVar140 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._6264_4_ * fVar130 +
               (float)bezier_basis0._7420_4_ * fVar142 + fVar180 * (float)bezier_basis0._8576_4_;
          auVar85._12_4_ =
               fVar127 * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._6268_4_ * fVar94 +
               (float)bezier_basis0._7424_4_ * fVar90 + fVar181 * (float)bezier_basis0._8580_4_;
          auVar85._16_4_ =
               fVar182 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._6272_4_ * fVar69 +
               (float)bezier_basis0._7428_4_ * fVar143 + fVar177 * (float)bezier_basis0._8584_4_;
          auVar85._20_4_ =
               fVar141 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._6276_4_ * fVar129 +
               (float)bezier_basis0._7432_4_ * fVar190 + fVar179 * (float)bezier_basis0._8588_4_;
          auVar85._24_4_ =
               fVar140 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._6280_4_ * fVar130 +
               (float)bezier_basis0._7436_4_ * fVar142 + fVar180 * (float)bezier_basis0._8592_4_;
          auVar85._28_4_ = fVar127 + fVar56;
          auVar121._0_4_ =
               fVar188 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._7412_4_ * fVar57 + fVar183 * (float)bezier_basis0._8568_4_ +
               (float)bezier_basis0._6256_4_ * fVar70;
          auVar121._4_4_ =
               fVar126 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._7416_4_ * fVar192 + fVar189 * (float)bezier_basis0._8572_4_ +
               (float)bezier_basis0._6260_4_ * fVar138;
          auVar121._8_4_ =
               fVar72 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._7420_4_ * fVar128 + fVar191 * (float)bezier_basis0._8576_4_ +
               (float)bezier_basis0._6264_4_ * fVar152;
          auVar121._12_4_ =
               auVar34._12_4_ * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._7424_4_ * fVar92 + fVar193 * (float)bezier_basis0._8580_4_ +
               (float)bezier_basis0._6268_4_ * fVar111;
          auVar121._16_4_ =
               fVar188 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._7428_4_ * fVar57 + fVar183 * (float)bezier_basis0._8584_4_ +
               (float)bezier_basis0._6272_4_ * fVar70;
          auVar121._20_4_ =
               fVar126 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._7432_4_ * fVar192 + fVar189 * (float)bezier_basis0._8588_4_ +
               (float)bezier_basis0._6276_4_ * fVar138;
          auVar121._24_4_ =
               fVar72 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._7436_4_ * fVar128 + fVar191 * (float)bezier_basis0._8592_4_ +
               (float)bezier_basis0._6280_4_ * fVar152;
          auVar121._28_4_ = fVar56 + fVar193 + fVar181 + fVar111;
          auVar49._0_4_ =
               fVar166 * (float)bezier_basis0._5100_4_ +
               fVar194 * (float)bezier_basis0._7412_4_ + fVar206 * (float)bezier_basis0._8568_4_ +
               (float)bezier_basis0._6256_4_ * fVar71;
          auVar49._4_4_ =
               fVar175 * (float)bezier_basis0._5104_4_ +
               fVar199 * (float)bezier_basis0._7416_4_ + fVar211 * (float)bezier_basis0._8572_4_ +
               (float)bezier_basis0._6260_4_ * fVar124;
          auVar49._8_4_ =
               fVar176 * (float)bezier_basis0._5108_4_ +
               fVar200 * (float)bezier_basis0._7420_4_ + fVar212 * (float)bezier_basis0._8576_4_ +
               (float)bezier_basis0._6264_4_ * fVar139;
          auVar49._12_4_ =
               auVar58._12_4_ * (float)bezier_basis0._5112_4_ +
               fVar201 * (float)bezier_basis0._7424_4_ +
               auVar74._12_4_ * (float)bezier_basis0._8580_4_ +
               (float)bezier_basis0._6268_4_ * fVar125;
          auVar49._16_4_ =
               fVar166 * (float)bezier_basis0._5116_4_ +
               fVar194 * (float)bezier_basis0._7428_4_ + fVar206 * (float)bezier_basis0._8584_4_ +
               (float)bezier_basis0._6272_4_ * fVar71;
          auVar49._20_4_ =
               fVar175 * (float)bezier_basis0._5120_4_ +
               fVar199 * (float)bezier_basis0._7432_4_ + fVar211 * (float)bezier_basis0._8588_4_ +
               (float)bezier_basis0._6276_4_ * fVar124;
          auVar49._24_4_ =
               fVar176 * (float)bezier_basis0._5124_4_ +
               fVar200 * (float)bezier_basis0._7436_4_ + fVar212 * (float)bezier_basis0._8592_4_ +
               (float)bezier_basis0._6280_4_ * fVar139;
          auVar49._28_4_ = fVar56 + fVar201 + fVar193 + fVar125;
          auVar8 = vblendps_avx(auVar85,ZEXT832(0) << 0x20,1);
          auVar14._4_4_ = auVar8._4_4_ * 0.055555556;
          auVar14._0_4_ = auVar8._0_4_ * 0.055555556;
          auVar14._8_4_ = auVar8._8_4_ * 0.055555556;
          auVar14._12_4_ = auVar8._12_4_ * 0.055555556;
          auVar14._16_4_ = auVar8._16_4_ * 0.055555556;
          auVar14._20_4_ = auVar8._20_4_ * 0.055555556;
          auVar14._24_4_ = auVar8._24_4_ * 0.055555556;
          auVar14._28_4_ = auVar8._28_4_;
          auVar84 = vsubps_avx(auVar205,auVar14);
          auVar8 = vblendps_avx(auVar85,ZEXT832(0) << 0x20,0x80);
          auVar86._0_4_ = auVar205._0_4_ + auVar8._0_4_ * 0.055555556;
          auVar86._4_4_ = auVar205._4_4_ + auVar8._4_4_ * 0.055555556;
          auVar86._8_4_ = auVar205._8_4_ + auVar8._8_4_ * 0.055555556;
          auVar86._12_4_ = auVar205._12_4_ + auVar8._12_4_ * 0.055555556;
          auVar86._16_4_ = auVar205._16_4_ + auVar8._16_4_ * 0.055555556;
          auVar86._20_4_ = auVar205._20_4_ + auVar8._20_4_ * 0.055555556;
          auVar86._24_4_ = auVar205._24_4_ + auVar8._24_4_ * 0.055555556;
          auVar86._28_4_ = auVar205._28_4_ + auVar8._28_4_;
          auVar150._8_4_ = 0x7f800000;
          auVar150._0_8_ = 0x7f8000007f800000;
          auVar150._12_4_ = 0x7f800000;
          auVar150._16_4_ = 0x7f800000;
          auVar150._20_4_ = 0x7f800000;
          auVar150._24_4_ = 0x7f800000;
          auVar150._28_4_ = 0x7f800000;
          auVar8 = vminps_avx(auVar150,auVar205);
          auVar172 = vminps_avx(auVar84,auVar86);
          auVar173 = vminps_avx(auVar8,auVar172);
          auVar196 = ZEXT832(0) << 0x20;
          auVar8 = vblendps_avx(auVar121,auVar196,1);
          auVar15._4_4_ = auVar8._4_4_ * 0.055555556;
          auVar15._0_4_ = auVar8._0_4_ * 0.055555556;
          auVar15._8_4_ = auVar8._8_4_ * 0.055555556;
          auVar15._12_4_ = auVar8._12_4_ * 0.055555556;
          auVar15._16_4_ = auVar8._16_4_ * 0.055555556;
          auVar15._20_4_ = auVar8._20_4_ * 0.055555556;
          auVar15._24_4_ = auVar8._24_4_ * 0.055555556;
          auVar15._28_4_ = auVar8._28_4_;
          auVar174 = vsubps_avx(auVar165,auVar15);
          auVar8 = vblendps_avx(auVar121,auVar196,0x80);
          auVar122._0_4_ = auVar165._0_4_ + auVar8._0_4_ * 0.055555556;
          auVar122._4_4_ = auVar165._4_4_ + auVar8._4_4_ * 0.055555556;
          auVar122._8_4_ = auVar165._8_4_ + auVar8._8_4_ * 0.055555556;
          auVar122._12_4_ = auVar165._12_4_ + auVar8._12_4_ * 0.055555556;
          auVar122._16_4_ = auVar165._16_4_ + auVar8._16_4_ * 0.055555556;
          auVar122._20_4_ = auVar165._20_4_ + auVar8._20_4_ * 0.055555556;
          auVar122._24_4_ = auVar165._24_4_ + auVar8._24_4_ * 0.055555556;
          auVar122._28_4_ = auVar165._28_4_ + auVar8._28_4_;
          auVar8 = vminps_avx(auVar150,auVar165);
          auVar172 = vminps_avx(auVar174,auVar122);
          auVar13 = vminps_avx(auVar8,auVar172);
          auVar8 = vblendps_avx(auVar49,auVar196,1);
          auVar16._4_4_ = auVar8._4_4_ * 0.055555556;
          auVar16._0_4_ = auVar8._0_4_ * 0.055555556;
          auVar16._8_4_ = auVar8._8_4_ * 0.055555556;
          auVar16._12_4_ = auVar8._12_4_ * 0.055555556;
          auVar16._16_4_ = auVar8._16_4_ * 0.055555556;
          auVar16._20_4_ = auVar8._20_4_ * 0.055555556;
          auVar16._24_4_ = auVar8._24_4_ * 0.055555556;
          auVar16._28_4_ = auVar8._28_4_;
          auVar120 = vsubps_avx(auVar135,auVar16);
          auVar8 = vblendps_avx(auVar49,auVar196,0x80);
          auVar197._0_4_ = auVar135._0_4_ + auVar8._0_4_ * 0.055555556;
          auVar197._4_4_ = auVar135._4_4_ + auVar8._4_4_ * 0.055555556;
          auVar197._8_4_ = auVar135._8_4_ + auVar8._8_4_ * 0.055555556;
          auVar197._12_4_ = auVar135._12_4_ + auVar8._12_4_ * 0.055555556;
          auVar197._16_4_ = auVar135._16_4_ + auVar8._16_4_ * 0.055555556;
          auVar197._20_4_ = auVar135._20_4_ + auVar8._20_4_ * 0.055555556;
          auVar197._24_4_ = auVar135._24_4_ + auVar8._24_4_ * 0.055555556;
          auVar197._28_4_ = auVar135._28_4_ + auVar8._28_4_;
          auVar8 = vminps_avx(auVar150,auVar135);
          auVar172 = vminps_avx(auVar120,auVar197);
          auVar196 = vminps_avx(auVar8,auVar172);
          auVar8 = vmaxps_avx(auVar84,auVar86);
          auVar108._8_4_ = 0xff800000;
          auVar108._0_8_ = 0xff800000ff800000;
          auVar108._12_4_ = 0xff800000;
          auVar108._16_4_ = 0xff800000;
          auVar108._20_4_ = 0xff800000;
          auVar108._24_4_ = 0xff800000;
          auVar108._28_4_ = 0xff800000;
          auVar172 = vmaxps_avx(auVar108,auVar205);
          auVar8 = vmaxps_avx(auVar172,auVar8);
          auVar172 = vmaxps_avx(auVar174,auVar122);
          auVar84 = vmaxps_avx(auVar108,auVar165);
          auVar172 = vmaxps_avx(auVar84,auVar172);
          auVar84 = vmaxps_avx(auVar120,auVar197);
          auVar174 = vmaxps_avx(auVar108,auVar135);
          auVar84 = vmaxps_avx(auVar174,auVar84);
          auVar174 = vshufps_avx(auVar173,auVar173,0xb1);
          auVar174 = vminps_avx(auVar173,auVar174);
          auVar173 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar173);
          auVar34 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar174 = vshufps_avx(auVar13,auVar13,0xb1);
          auVar174 = vminps_avx(auVar13,auVar174);
          auVar173 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar173);
          auVar74 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar74 = vunpcklps_avx(auVar34,auVar74);
          auVar174 = vshufps_avx(auVar196,auVar196,0xb1);
          auVar174 = vminps_avx(auVar196,auVar174);
          auVar173 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar173);
          auVar34 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar34 = vinsertps_avx(auVar74,auVar34,0x28);
          auVar174 = vshufps_avx(auVar8,auVar8,0xb1);
          auVar8 = vmaxps_avx(auVar8,auVar174);
          auVar174 = vshufpd_avx(auVar8,auVar8,5);
          auVar8 = vmaxps_avx(auVar8,auVar174);
          auVar74 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
          auVar8 = vshufps_avx(auVar172,auVar172,0xb1);
          auVar8 = vmaxps_avx(auVar172,auVar8);
          auVar172 = vshufpd_avx(auVar8,auVar8,5);
          auVar8 = vmaxps_avx(auVar8,auVar172);
          auVar58 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
          auVar103._0_4_ = (auVar116._0_4_ + auVar41._0_4_) * 0.33333334;
          auVar103._4_4_ = (auVar116._4_4_ + auVar41._4_4_) * 0.33333334;
          auVar103._8_4_ = (auVar116._8_4_ + auVar41._8_4_) * 0.33333334;
          auVar103._12_4_ = (auVar116._12_4_ + auVar41._12_4_) * 0.33333334;
          auVar35 = vsubps_avx(_local_188,auVar103);
          auVar58 = vunpcklps_avx(auVar74,auVar58);
          auVar8 = vshufps_avx(auVar84,auVar84,0xb1);
          auVar8 = vmaxps_avx(auVar84,auVar8);
          auVar172 = vshufpd_avx(auVar8,auVar8,5);
          auVar8 = vmaxps_avx(auVar8,auVar172);
          auVar74 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
          auVar74 = vinsertps_avx(auVar58,auVar74,0x28);
          auVar58 = vshufps_avx(auVar35,auVar35,0);
          auVar77 = vshufps_avx(_local_188,_local_188,0);
          fVar179 = auVar77._0_4_;
          fVar180 = auVar77._4_4_;
          fVar181 = auVar77._8_4_;
          fVar183 = auVar77._12_4_;
          fVar189 = auVar58._0_4_;
          fVar191 = auVar58._4_4_;
          fVar193 = auVar58._8_4_;
          fVar194 = auVar58._12_4_;
          auVar58 = vshufps_avx(auVar35,auVar35,0x55);
          auVar77 = vshufps_avx(_local_188,_local_188,0x55);
          fVar139 = auVar77._0_4_;
          fVar140 = auVar77._4_4_;
          fVar72 = auVar77._8_4_;
          fVar90 = auVar77._12_4_;
          fVar166 = auVar58._0_4_;
          fVar175 = auVar58._4_4_;
          fVar176 = auVar58._8_4_;
          fVar177 = auVar58._12_4_;
          auVar58 = vshufps_avx(auVar35,auVar35,0xaa);
          auVar77 = vshufps_avx(_local_188,_local_188,0xaa);
          fVar143 = auVar77._0_4_;
          fVar57 = auVar77._4_4_;
          fVar69 = auVar77._8_4_;
          fVar70 = auVar77._12_4_;
          fVar190 = auVar58._0_4_;
          fVar138 = auVar58._4_4_;
          fVar126 = auVar58._8_4_;
          auVar21._4_4_ = fVar91;
          auVar21._0_4_ = fVar73;
          auVar21._8_4_ = fVar93;
          auVar21._12_4_ = fVar95;
          auVar117._0_4_ = fVar73 + (fVar33 + auVar147._0_4_) * 0.33333334;
          auVar117._4_4_ = fVar91 + (fVar53 + auVar147._4_4_) * 0.33333334;
          auVar117._8_4_ = fVar93 + (fVar54 + auVar147._8_4_) * 0.33333334;
          auVar117._12_4_ = fVar95 + (fVar55 + auVar147._12_4_) * 0.33333334;
          auVar77 = vshufps_avx(auVar117,auVar117,0);
          fVar192 = auVar77._0_4_;
          fVar124 = auVar77._4_4_;
          fVar142 = auVar77._8_4_;
          auVar35 = vshufps_avx(auVar117,auVar117,0x55);
          fVar92 = auVar35._0_4_;
          fVar94 = auVar35._4_4_;
          fVar111 = auVar35._8_4_;
          fVar125 = auVar35._12_4_;
          auVar35 = vshufps_avx(auVar117,auVar117,0xaa);
          fVar54 = auVar35._0_4_;
          fVar55 = auVar35._4_4_;
          fVar56 = auVar35._8_4_;
          fVar152 = (float)bezier_basis0._2816_4_ + 0.0 + 0.0;
          auVar9 = vshufps_avx(auVar21,auVar21,0);
          fVar127 = auVar9._0_4_;
          fVar33 = auVar9._4_4_;
          fVar53 = auVar9._8_4_;
          auVar210._0_4_ =
               fVar127 * (float)bezier_basis0._476_4_ +
               fVar192 * (float)bezier_basis0._1632_4_ +
               fVar189 * (float)bezier_basis0._2788_4_ + fVar179 * (float)bezier_basis0._3944_4_;
          auVar210._4_4_ =
               fVar33 * (float)bezier_basis0._480_4_ +
               fVar124 * (float)bezier_basis0._1636_4_ +
               fVar191 * (float)bezier_basis0._2792_4_ + fVar180 * (float)bezier_basis0._3948_4_;
          auVar210._8_4_ =
               fVar53 * (float)bezier_basis0._484_4_ +
               fVar142 * (float)bezier_basis0._1640_4_ +
               fVar193 * (float)bezier_basis0._2796_4_ + fVar181 * (float)bezier_basis0._3952_4_;
          auVar210._12_4_ =
               auVar9._12_4_ * (float)bezier_basis0._488_4_ +
               auVar77._12_4_ * (float)bezier_basis0._1644_4_ +
               fVar194 * (float)bezier_basis0._2800_4_ + fVar183 * (float)bezier_basis0._3956_4_;
          auVar210._16_4_ =
               fVar127 * (float)bezier_basis0._492_4_ +
               fVar192 * (float)bezier_basis0._1648_4_ +
               fVar189 * (float)bezier_basis0._2804_4_ + fVar179 * (float)bezier_basis0._3960_4_;
          auVar210._20_4_ =
               fVar33 * (float)bezier_basis0._496_4_ +
               fVar124 * (float)bezier_basis0._1652_4_ +
               fVar191 * (float)bezier_basis0._2808_4_ + fVar180 * (float)bezier_basis0._3964_4_;
          auVar210._24_4_ =
               fVar53 * (float)bezier_basis0._500_4_ +
               fVar142 * (float)bezier_basis0._1656_4_ +
               fVar193 * (float)bezier_basis0._2812_4_ + fVar181 * (float)bezier_basis0._3968_4_;
          auVar210._28_4_ = auVar13._28_4_ + 0.0 + 0.0;
          auVar36 = vshufps_avx(auVar21,auVar21,0x55);
          fVar129 = auVar36._0_4_;
          fVar141 = auVar36._4_4_;
          fVar128 = auVar36._8_4_;
          fVar130 = auVar36._12_4_;
          auVar123._0_4_ =
               fVar129 * (float)bezier_basis0._476_4_ +
               fVar92 * (float)bezier_basis0._1632_4_ +
               fVar166 * (float)bezier_basis0._2788_4_ + fVar139 * (float)bezier_basis0._3944_4_;
          auVar123._4_4_ =
               fVar141 * (float)bezier_basis0._480_4_ +
               fVar94 * (float)bezier_basis0._1636_4_ +
               fVar175 * (float)bezier_basis0._2792_4_ + fVar140 * (float)bezier_basis0._3948_4_;
          auVar123._8_4_ =
               fVar128 * (float)bezier_basis0._484_4_ +
               fVar111 * (float)bezier_basis0._1640_4_ +
               fVar176 * (float)bezier_basis0._2796_4_ + fVar72 * (float)bezier_basis0._3952_4_;
          auVar123._12_4_ =
               fVar130 * (float)bezier_basis0._488_4_ +
               fVar125 * (float)bezier_basis0._1644_4_ +
               fVar177 * (float)bezier_basis0._2800_4_ + fVar90 * (float)bezier_basis0._3956_4_;
          auVar123._16_4_ =
               fVar129 * (float)bezier_basis0._492_4_ +
               fVar92 * (float)bezier_basis0._1648_4_ +
               fVar166 * (float)bezier_basis0._2804_4_ + fVar139 * (float)bezier_basis0._3960_4_;
          auVar123._20_4_ =
               fVar141 * (float)bezier_basis0._496_4_ +
               fVar94 * (float)bezier_basis0._1652_4_ +
               fVar175 * (float)bezier_basis0._2808_4_ + fVar140 * (float)bezier_basis0._3964_4_;
          auVar123._24_4_ =
               fVar128 * (float)bezier_basis0._500_4_ +
               fVar111 * (float)bezier_basis0._1656_4_ +
               fVar176 * (float)bezier_basis0._2812_4_ + fVar72 * (float)bezier_basis0._3968_4_;
          auVar123._28_4_ = auVar120._28_4_ + (float)bezier_basis0._3972_4_ + 0.0 + 0.0;
          auVar36 = vshufps_avx(auVar21,auVar21,0xaa);
          fVar71 = auVar36._0_4_;
          fVar182 = auVar36._4_4_;
          fVar188 = auVar36._8_4_;
          auVar68._0_4_ =
               fVar71 * (float)bezier_basis0._476_4_ +
               fVar54 * (float)bezier_basis0._1632_4_ +
               fVar190 * (float)bezier_basis0._2788_4_ + (float)bezier_basis0._3944_4_ * fVar143;
          auVar68._4_4_ =
               fVar182 * (float)bezier_basis0._480_4_ +
               fVar55 * (float)bezier_basis0._1636_4_ +
               fVar138 * (float)bezier_basis0._2792_4_ + (float)bezier_basis0._3948_4_ * fVar57;
          auVar68._8_4_ =
               fVar188 * (float)bezier_basis0._484_4_ +
               fVar56 * (float)bezier_basis0._1640_4_ +
               fVar126 * (float)bezier_basis0._2796_4_ + (float)bezier_basis0._3952_4_ * fVar69;
          auVar68._12_4_ =
               auVar36._12_4_ * (float)bezier_basis0._488_4_ +
               auVar35._12_4_ * (float)bezier_basis0._1644_4_ +
               auVar58._12_4_ * (float)bezier_basis0._2800_4_ +
               (float)bezier_basis0._3956_4_ * fVar70;
          auVar68._16_4_ =
               fVar71 * (float)bezier_basis0._492_4_ +
               fVar54 * (float)bezier_basis0._1648_4_ +
               fVar190 * (float)bezier_basis0._2804_4_ + (float)bezier_basis0._3960_4_ * fVar143;
          auVar68._20_4_ =
               fVar182 * (float)bezier_basis0._496_4_ +
               fVar55 * (float)bezier_basis0._1652_4_ +
               fVar138 * (float)bezier_basis0._2808_4_ + (float)bezier_basis0._3964_4_ * fVar57;
          auVar68._24_4_ =
               fVar188 * (float)bezier_basis0._500_4_ +
               fVar56 * (float)bezier_basis0._1656_4_ +
               fVar126 * (float)bezier_basis0._2812_4_ + (float)bezier_basis0._3968_4_ * fVar69;
          auVar68._28_4_ = fVar152 + 0.0;
          auVar87._0_4_ =
               fVar127 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._6256_4_ * fVar192 +
               fVar189 * (float)bezier_basis0._7412_4_ + fVar179 * (float)bezier_basis0._8568_4_;
          auVar87._4_4_ =
               fVar33 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._6260_4_ * fVar124 +
               fVar191 * (float)bezier_basis0._7416_4_ + fVar180 * (float)bezier_basis0._8572_4_;
          auVar87._8_4_ =
               fVar53 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._6264_4_ * fVar142 +
               fVar193 * (float)bezier_basis0._7420_4_ + fVar181 * (float)bezier_basis0._8576_4_;
          auVar87._12_4_ =
               auVar9._12_4_ * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._6268_4_ * auVar77._12_4_ +
               fVar194 * (float)bezier_basis0._7424_4_ + fVar183 * (float)bezier_basis0._8580_4_;
          auVar87._16_4_ =
               fVar127 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._6272_4_ * fVar192 +
               fVar189 * (float)bezier_basis0._7428_4_ + fVar179 * (float)bezier_basis0._8584_4_;
          auVar87._20_4_ =
               fVar33 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._6276_4_ * fVar124 +
               fVar191 * (float)bezier_basis0._7432_4_ + fVar180 * (float)bezier_basis0._8588_4_;
          auVar87._24_4_ =
               fVar53 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._6280_4_ * fVar142 +
               fVar193 * (float)bezier_basis0._7436_4_ + fVar181 * (float)bezier_basis0._8592_4_;
          auVar87._28_4_ = fVar90 + fVar194 + fVar152 + 0.0;
          auVar136._0_4_ =
               fVar92 * (float)bezier_basis0._6256_4_ +
               fVar166 * (float)bezier_basis0._7412_4_ + fVar139 * (float)bezier_basis0._8568_4_ +
               fVar129 * (float)bezier_basis0._5100_4_;
          auVar136._4_4_ =
               fVar94 * (float)bezier_basis0._6260_4_ +
               fVar175 * (float)bezier_basis0._7416_4_ + fVar140 * (float)bezier_basis0._8572_4_ +
               fVar141 * (float)bezier_basis0._5104_4_;
          auVar136._8_4_ =
               fVar111 * (float)bezier_basis0._6264_4_ +
               fVar176 * (float)bezier_basis0._7420_4_ + fVar72 * (float)bezier_basis0._8576_4_ +
               fVar128 * (float)bezier_basis0._5108_4_;
          auVar136._12_4_ =
               fVar125 * (float)bezier_basis0._6268_4_ +
               fVar177 * (float)bezier_basis0._7424_4_ + fVar90 * (float)bezier_basis0._8580_4_ +
               fVar130 * (float)bezier_basis0._5112_4_;
          auVar136._16_4_ =
               fVar92 * (float)bezier_basis0._6272_4_ +
               fVar166 * (float)bezier_basis0._7428_4_ + fVar139 * (float)bezier_basis0._8584_4_ +
               fVar129 * (float)bezier_basis0._5116_4_;
          auVar136._20_4_ =
               fVar94 * (float)bezier_basis0._6276_4_ +
               fVar175 * (float)bezier_basis0._7432_4_ + fVar140 * (float)bezier_basis0._8588_4_ +
               fVar141 * (float)bezier_basis0._5120_4_;
          auVar136._24_4_ =
               fVar111 * (float)bezier_basis0._6280_4_ +
               fVar176 * (float)bezier_basis0._7436_4_ + fVar72 * (float)bezier_basis0._8592_4_ +
               fVar128 * (float)bezier_basis0._5124_4_;
          auVar136._28_4_ = fVar90 + fVar177 + fVar183 + fVar130;
          auVar50._0_4_ =
               fVar71 * (float)bezier_basis0._5100_4_ +
               fVar54 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar190 + fVar143 * (float)bezier_basis0._8568_4_;
          auVar50._4_4_ =
               fVar182 * (float)bezier_basis0._5104_4_ +
               fVar55 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar138 + fVar57 * (float)bezier_basis0._8572_4_;
          auVar50._8_4_ =
               fVar188 * (float)bezier_basis0._5108_4_ +
               fVar56 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar126 + fVar69 * (float)bezier_basis0._8576_4_;
          auVar50._12_4_ =
               auVar36._12_4_ * (float)bezier_basis0._5112_4_ +
               auVar35._12_4_ * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * auVar58._12_4_ +
               fVar70 * (float)bezier_basis0._8580_4_;
          auVar50._16_4_ =
               fVar71 * (float)bezier_basis0._5116_4_ +
               fVar54 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar190 + fVar143 * (float)bezier_basis0._8584_4_;
          auVar50._20_4_ =
               fVar182 * (float)bezier_basis0._5120_4_ +
               fVar55 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar138 + fVar57 * (float)bezier_basis0._8588_4_;
          auVar50._24_4_ =
               fVar188 * (float)bezier_basis0._5124_4_ +
               fVar56 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar126 + fVar69 * (float)bezier_basis0._8592_4_;
          auVar50._28_4_ = (float)bezier_basis0._5128_4_ + fVar125 + fVar90 + fVar70;
          auVar8 = vblendps_avx(auVar87,ZEXT832(0) << 0x20,1);
          auVar172 = vblendps_avx(auVar136,ZEXT832(0) << 0x20,1);
          auVar174 = ZEXT832(0) << 0x20;
          auVar84 = vblendps_avx(auVar50,auVar174,1);
          auVar17._4_4_ = auVar8._4_4_ * 0.055555556;
          auVar17._0_4_ = auVar8._0_4_ * 0.055555556;
          auVar17._8_4_ = auVar8._8_4_ * 0.055555556;
          auVar17._12_4_ = auVar8._12_4_ * 0.055555556;
          auVar17._16_4_ = auVar8._16_4_ * 0.055555556;
          auVar17._20_4_ = auVar8._20_4_ * 0.055555556;
          auVar17._24_4_ = auVar8._24_4_ * 0.055555556;
          auVar17._28_4_ = auVar8._28_4_;
          auVar18._4_4_ = auVar172._4_4_ * 0.055555556;
          auVar18._0_4_ = auVar172._0_4_ * 0.055555556;
          auVar18._8_4_ = auVar172._8_4_ * 0.055555556;
          auVar18._12_4_ = auVar172._12_4_ * 0.055555556;
          auVar18._16_4_ = auVar172._16_4_ * 0.055555556;
          auVar18._20_4_ = auVar172._20_4_ * 0.055555556;
          auVar18._24_4_ = auVar172._24_4_ * 0.055555556;
          auVar18._28_4_ = auVar172._28_4_;
          auVar19._4_4_ = auVar84._4_4_ * 0.055555556;
          auVar19._0_4_ = auVar84._0_4_ * 0.055555556;
          auVar19._8_4_ = auVar84._8_4_ * 0.055555556;
          auVar19._12_4_ = auVar84._12_4_ * 0.055555556;
          auVar19._16_4_ = auVar84._16_4_ * 0.055555556;
          auVar19._20_4_ = auVar84._20_4_ * 0.055555556;
          auVar19._24_4_ = auVar84._24_4_ * 0.055555556;
          auVar19._28_4_ = auVar84._28_4_;
          auVar120 = vsubps_avx(auVar210,auVar17);
          auVar14 = vsubps_avx(auVar123,auVar18);
          auVar44 = vsubps_avx(auVar68,auVar19);
          auVar8 = vblendps_avx(auVar87,auVar174,0x80);
          auVar172 = vblendps_avx(auVar136,auVar174,0x80);
          auVar84 = vblendps_avx(auVar50,auVar174,0x80);
          auVar88._0_4_ = auVar210._0_4_ + auVar8._0_4_ * 0.055555556;
          auVar88._4_4_ = auVar210._4_4_ + auVar8._4_4_ * 0.055555556;
          auVar88._8_4_ = auVar210._8_4_ + auVar8._8_4_ * 0.055555556;
          auVar88._12_4_ = auVar210._12_4_ + auVar8._12_4_ * 0.055555556;
          auVar88._16_4_ = auVar210._16_4_ + auVar8._16_4_ * 0.055555556;
          auVar88._20_4_ = auVar210._20_4_ + auVar8._20_4_ * 0.055555556;
          auVar88._24_4_ = auVar210._24_4_ + auVar8._24_4_ * 0.055555556;
          auVar88._28_4_ = auVar210._28_4_ + auVar8._28_4_;
          auVar137._0_4_ = auVar123._0_4_ + auVar172._0_4_ * 0.055555556;
          auVar137._4_4_ = auVar123._4_4_ + auVar172._4_4_ * 0.055555556;
          auVar137._8_4_ = auVar123._8_4_ + auVar172._8_4_ * 0.055555556;
          auVar137._12_4_ = auVar123._12_4_ + auVar172._12_4_ * 0.055555556;
          auVar137._16_4_ = auVar123._16_4_ + auVar172._16_4_ * 0.055555556;
          auVar137._20_4_ = auVar123._20_4_ + auVar172._20_4_ * 0.055555556;
          auVar137._24_4_ = auVar123._24_4_ + auVar172._24_4_ * 0.055555556;
          auVar137._28_4_ = auVar123._28_4_ + auVar172._28_4_;
          auVar51._0_4_ = auVar68._0_4_ + auVar84._0_4_ * 0.055555556;
          auVar51._4_4_ = auVar68._4_4_ + auVar84._4_4_ * 0.055555556;
          auVar51._8_4_ = auVar68._8_4_ + auVar84._8_4_ * 0.055555556;
          auVar51._12_4_ = auVar68._12_4_ + auVar84._12_4_ * 0.055555556;
          auVar51._16_4_ = auVar68._16_4_ + auVar84._16_4_ * 0.055555556;
          auVar51._20_4_ = auVar68._20_4_ + auVar84._20_4_ * 0.055555556;
          auVar51._24_4_ = auVar68._24_4_ + auVar84._24_4_ * 0.055555556;
          auVar51._28_4_ = auVar68._28_4_ + auVar84._28_4_;
          auVar109._8_4_ = 0x7f800000;
          auVar109._0_8_ = 0x7f8000007f800000;
          auVar109._12_4_ = 0x7f800000;
          auVar109._16_4_ = 0x7f800000;
          auVar109._20_4_ = 0x7f800000;
          auVar109._24_4_ = 0x7f800000;
          auVar109._28_4_ = 0x7f800000;
          auVar8 = vminps_avx(auVar109,auVar210);
          auVar172 = vminps_avx(auVar109,auVar123);
          auVar84 = vminps_avx(auVar109,auVar68);
          auVar174 = vminps_avx(auVar120,auVar88);
          auVar173 = vminps_avx(auVar8,auVar174);
          auVar8 = vminps_avx(auVar14,auVar137);
          auVar13 = vminps_avx(auVar172,auVar8);
          auVar8 = vminps_avx(auVar44,auVar51);
          auVar196 = vminps_avx(auVar84,auVar8);
          auVar8 = vmaxps_avx(auVar120,auVar88);
          auVar151._8_4_ = 0xff800000;
          auVar151._0_8_ = 0xff800000ff800000;
          auVar151._12_4_ = 0xff800000;
          auVar151._16_4_ = 0xff800000;
          auVar151._20_4_ = 0xff800000;
          auVar151._24_4_ = 0xff800000;
          auVar151._28_4_ = 0xff800000;
          auVar172 = vmaxps_avx(auVar151,auVar210);
          auVar8 = vmaxps_avx(auVar172,auVar8);
          auVar172 = vmaxps_avx(auVar14,auVar137);
          auVar198 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar84 = vmaxps_avx(auVar151,auVar123);
          auVar172 = vmaxps_avx(auVar84,auVar172);
          auVar84 = vmaxps_avx(auVar44,auVar51);
          auVar174 = vmaxps_avx(auVar151,auVar68);
          auVar84 = vmaxps_avx(auVar174,auVar84);
          auVar174 = vshufps_avx(auVar173,auVar173,0xb1);
          auVar174 = vminps_avx(auVar173,auVar174);
          auVar173 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar173);
          auVar58 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar174 = vshufps_avx(auVar13,auVar13,0xb1);
          auVar174 = vminps_avx(auVar13,auVar174);
          auVar173 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar173);
          auVar77 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar77 = vunpcklps_avx(auVar58,auVar77);
          auVar174 = vshufps_avx(auVar196,auVar196,0xb1);
          auVar174 = vminps_avx(auVar196,auVar174);
          auVar173 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar173);
          auVar58 = vminps_avx(auVar174._0_16_,auVar174._16_16_);
          auVar58 = vinsertps_avx(auVar77,auVar58,0x28);
          auVar77 = vminps_avx(auVar34,auVar58);
          auVar174 = vshufps_avx(auVar8,auVar8,0xb1);
          auVar8 = vmaxps_avx(auVar8,auVar174);
          auVar174 = vshufpd_avx(auVar8,auVar8,5);
          auVar8 = vmaxps_avx(auVar8,auVar174);
          auVar34 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
          auVar8 = vshufps_avx(auVar172,auVar172,0xb1);
          auVar8 = vmaxps_avx(auVar172,auVar8);
          auVar172 = vshufpd_avx(auVar8,auVar8,5);
          auVar8 = vmaxps_avx(auVar8,auVar172);
          auVar58 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
          auVar58 = vunpcklps_avx(auVar34,auVar58);
          auVar8 = vshufps_avx(auVar84,auVar84,0xb1);
          auVar8 = vmaxps_avx(auVar84,auVar8);
          auVar172 = vshufpd_avx(auVar8,auVar8,5);
          auVar8 = vmaxps_avx(auVar8,auVar172);
          auVar34 = vmaxps_avx(auVar8._0_16_,auVar8._16_16_);
          auVar34 = vinsertps_avx(auVar58,auVar34,0x28);
          auVar58 = vmaxps_avx(auVar74,auVar34);
          auVar104._8_4_ = 0x7fffffff;
          auVar104._0_8_ = 0x7fffffff7fffffff;
          auVar104._12_4_ = 0x7fffffff;
          auVar34 = vandps_avx(auVar77,auVar104);
          auVar74 = vandps_avx(auVar58,auVar104);
          auVar34 = vmaxps_avx(auVar34,auVar74);
          auVar74 = vmovshdup_avx(auVar34);
          auVar74 = vmaxss_avx(auVar74,auVar34);
          auVar34 = vshufpd_avx(auVar34,auVar34,1);
          auVar34 = vmaxss_avx(auVar34,auVar74);
          auVar110 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          auVar34 = ZEXT416((uint)(auVar34._0_4_ * 4.7683716e-07));
          auVar34 = vshufps_avx(auVar34,auVar34,0);
          auVar74 = vsubps_avx(auVar77,auVar34);
          aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar74,ZEXT416(geomID),0x30);
          auVar43._0_4_ = auVar58._0_4_ + auVar34._0_4_;
          auVar43._4_4_ = auVar58._4_4_ + auVar34._4_4_;
          auVar43._8_4_ = auVar58._8_4_ + auVar34._8_4_;
          auVar43._12_4_ = auVar58._12_4_ + auVar34._12_4_;
          aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar43,ZEXT416((uint)uVar29),0x30);
          auVar82._0_4_ = aVar11.x + aVar12.x;
          auVar82._4_4_ = aVar11.y + aVar12.y;
          auVar82._8_4_ = aVar11.z + aVar12.z;
          auVar82._12_4_ = aVar11.field_3.w + aVar12.field_3.w;
          local_248 = vminps_avx(local_248,auVar82);
          local_238 = vmaxps_avx(local_238,auVar82);
          auVar34 = vmaxps_avx(auVar89._0_16_,(undefined1  [16])aVar12);
          auVar89 = ZEXT1664(auVar34);
          prims[local_270].upper.field_0.field_1 = aVar12;
          auVar34 = vminps_avx(auVar52._0_16_,(undefined1  [16])aVar11);
          auVar52 = ZEXT1664(auVar34);
          prims[local_270].lower.field_0.field_1 = aVar11;
          local_288 = local_288 + 1;
          local_270 = local_270 + 1;
        }
        else {
          auVar52 = ZEXT1664(auVar52._0_16_);
          auVar89 = ZEXT1664(auVar89._0_16_);
        }
      }
      auVar34 = auVar52._0_16_;
      auVar74 = auVar89._0_16_;
      uVar29 = uVar29 + 1;
    } while (uVar29 < r->_end);
  }
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = auVar34;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = auVar74;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_248._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = local_248._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_238._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = local_238._8_8_;
  __return_storage_ptr__->end = local_288;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }